

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void secp256k1_ellswift_xswiftec_frac_var
               (secp256k1_fe *xn,secp256k1_fe *xd,secp256k1_fe *u,secp256k1_fe *t)

{
  char *pcVar1;
  uint *pk_parity;
  undefined1 auVar2 [16];
  char cVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  uchar *puVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  ulong uVar12;
  FILE *__stream;
  size_t sVar13;
  secp256k1_ge *psVar14;
  secp256k1_context *psVar15;
  void *pvVar16;
  void *pvVar17;
  ulong extraout_RAX;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  void *pvVar21;
  ulong uVar22;
  secp256k1_fe *a;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  bool bVar23;
  uint uVar24;
  secp256k1_gej *psVar25;
  char *pcVar26;
  long lVar27;
  FILE *pFVar28;
  uint64_t uVar29;
  uint uVar30;
  undefined1 *puVar31;
  ulong uVar32;
  ulong uVar33;
  secp256k1_fe *a_00;
  secp256k1_gej *psVar34;
  _func_void_char_ptr_void_ptr *p_Var35;
  uint64_t *puVar36;
  ulong uVar37;
  secp256k1_context *psVar38;
  secp256k1_ge *psVar39;
  ulong in_R8;
  code *na;
  uint64_t uVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  secp256k1_fe *psVar44;
  secp256k1_fe *psVar45;
  secp256k1_gej *psVar46;
  long lVar47;
  secp256k1_scalar *psVar48;
  uint uVar49;
  secp256k1_context *psVar50;
  undefined1 *puVar51;
  undefined1 *puVar52;
  secp256k1_scalar *r;
  secp256k1_keypair *keypair;
  uchar *puVar53;
  secp256k1_context *a_01;
  secp256k1_xonly_pubkey *psVar54;
  bool bVar55;
  byte bVar56;
  undefined1 auVar57 [16];
  secp256k1_fe s;
  secp256k1_fe u1;
  secp256k1_fe d;
  secp256k1_fe g;
  secp256k1_gej *psStack_1e68;
  secp256k1_gej *psStack_1e60;
  secp256k1_scalar *psStack_1e50;
  ulong uStack_1e48;
  secp256k1_scalar *psStack_1e40;
  int iStack_1e34;
  secp256k1_gej *psStack_1e30;
  uint64_t uStack_1e28;
  undefined1 auStack_1e20 [16];
  undefined1 auStack_1e10 [16];
  undefined1 auStack_1e00 [16];
  int iStack_1df0;
  undefined1 auStack_1de0 [16];
  undefined1 auStack_1dd0 [16];
  int iStack_1db4;
  undefined1 auStack_1db0 [48];
  _func_void_char_ptr_void_ptr *p_Stack_1d80;
  secp256k1_scalar *psStack_1d78;
  _func_void_char_ptr_void_ptr *p_Stack_1d70;
  secp256k1_context *psStack_1d68;
  uint uStack_1d5c;
  ulong uStack_1d58;
  secp256k1_context *psStack_1d50;
  uint64_t uStack_1d48;
  secp256k1_callback sStack_1d40;
  secp256k1_callback sStack_1d30;
  uint64_t uStack_1d20;
  secp256k1_scalar *psStack_1d18;
  _func_void_char_ptr_void_ptr *p_Stack_1d10;
  secp256k1_gej *psStack_1d08;
  _func_void_char_ptr_void_ptr *p_Stack_1d00;
  undefined1 *puStack_1cf8;
  secp256k1_gej *psStack_1cf0;
  secp256k1_schnorrsig_extraparams sStack_1ce8;
  undefined1 auStack_1cd0 [16];
  undefined1 auStack_1cc0 [16];
  undefined1 auStack_1cb0 [16];
  undefined1 auStack_1ca0 [16];
  undefined1 auStack_1b70 [32];
  uchar auStack_1b50 [32];
  undefined1 auStack_1b30 [56];
  uchar auStack_1af8 [8];
  undefined1 auStack_1af0 [16];
  undefined4 uStack_1ae0;
  undefined4 uStack_1adc;
  int iStack_1ad8;
  int iStack_1ad4;
  int iStack_1ad0;
  uchar auStack_1850 [32];
  undefined1 auStack_1830 [16];
  undefined1 auStack_1820 [16];
  uchar auStack_1810 [4];
  uchar auStack_180c [4];
  int iStack_1808;
  int iStack_1804;
  undefined1 auStack_1590 [96];
  secp256k1_context asStack_1530 [5];
  undefined1 auStack_10b0 [32];
  undefined4 uStack_1090;
  undefined4 uStack_108c;
  int iStack_1088;
  int iStack_1084;
  ulong uStack_1080;
  uint64_t auStack_1078 [2];
  uint64_t uStack_1068;
  uchar auStack_1060 [4];
  uchar auStack_105c [4];
  int aiStack_1058 [4];
  secp256k1_context asStack_1048 [5];
  secp256k1_ge sStack_bd0;
  undefined1 auStack_b68 [8];
  undefined1 auStack_b60 [152];
  secp256k1_context asStack_ac8 [9];
  secp256k1_gej *psStack_3a8;
  secp256k1_fe *psStack_3a0;
  secp256k1_gej *psStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  code *pcStack_380;
  secp256k1_gej *psStack_378;
  code *pcStack_368;
  secp256k1_gej *psStack_358;
  undefined1 auStack_350 [24];
  uint64_t uStack_338;
  uint64_t uStack_330;
  int iStack_328;
  int iStack_324;
  secp256k1_fe sStack_320;
  undefined1 auStack_2f0 [24];
  uint64_t uStack_2d8;
  uint64_t uStack_2d0;
  int iStack_2c8;
  int iStack_2c4;
  secp256k1_fe sStack_290;
  int iStack_260;
  secp256k1_ge sStack_250;
  secp256k1_gej *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  code *pcStack_1c0;
  secp256k1_gej *local_1b0;
  undefined1 local_1a8 [56];
  uint64_t uStack_170;
  undefined1 local_168 [16];
  uint64_t local_158;
  uint uStack_150;
  int iStack_14c;
  secp256k1_fe local_148;
  secp256k1_fe local_118;
  secp256k1_fe local_e8;
  uint64_t local_b8;
  uint64_t uStack_b0;
  uint64_t local_a8;
  uint64_t uStack_a0;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  bVar56 = 0;
  psVar45 = (secp256k1_fe *)0xf000000000000;
  local_118.n[0] = u->n[0];
  local_118.n[1] = u->n[1];
  local_118.n[2] = u->n[2];
  local_118.n[3] = u->n[3];
  local_118.n[4] = u->n[4];
  local_118.magnitude = u->magnitude;
  local_118.normalized = u->normalized;
  pcStack_1c0 = (code *)0x11112f;
  local_1b0 = (secp256k1_gej *)xn;
  secp256k1_fe_verify(&local_118);
  psVar25 = (secp256k1_gej *)0x1000003d1;
  uVar12 = (local_118.n[4] >> 0x30) * 0x1000003d1 + local_118.n[0];
  psVar44 = (secp256k1_fe *)0xffffefffffc2f;
  if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
    uVar22 = (uVar12 >> 0x34) + local_118.n[1];
    uVar32 = (uVar22 >> 0x34) + local_118.n[2];
    uVar37 = (uVar32 >> 0x34) + local_118.n[3];
    in_R8 = (uVar37 >> 0x34) + (local_118.n[4] & 0xffffffffffff);
    if (((uVar22 | uVar12 | uVar32 | uVar37) & 0xfffffffffffff) == 0 && in_R8 == 0)
    goto LAB_00111878;
    in_R8 = in_R8 ^ 0xf000000000000;
    if (((uVar12 | 0x1000003d0) & uVar22 & uVar32 & uVar37 & in_R8) == 0xfffffffffffff)
    goto LAB_00111878;
  }
  while( true ) {
    pcStack_1c0 = (code *)0x1111f2;
    secp256k1_fe_sqr(&local_148,t);
    pcStack_1c0 = (code *)0x1111fa;
    secp256k1_fe_verify(t);
    uVar12 = (t->n[4] >> 0x30) * 0x1000003d1 + t->n[0];
    if (((secp256k1_fe *)(uVar12 & 0xfffffffffffff) == psVar44) ||
       ((secp256k1_fe *)(uVar12 & 0xfffffffffffff) == (secp256k1_fe *)0x0)) {
      uVar22 = (uVar12 >> 0x34) + t->n[1];
      uVar32 = (uVar22 >> 0x34) + t->n[2];
      uVar37 = (uVar32 >> 0x34) + t->n[3];
      in_R8 = (uVar37 >> 0x34) + (t->n[4] & 0xffffffffffff);
      if ((((uVar22 | uVar12 | uVar32 | uVar37) & 0xfffffffffffff) == 0 && in_R8 == 0) ||
         (in_R8 = in_R8 ^ (ulong)psVar45,
         ((uVar12 | 0x1000003d0) & uVar22 & uVar32 & uVar37 & in_R8) == 0xfffffffffffff)) {
        local_148.n[4] = 0;
        local_148.magnitude = 1;
        local_148.normalized = 1;
        local_148.n[2] = 0;
        local_148.n[3] = 0;
        local_148.n[0] = 1;
        local_148.n[1] = 0;
      }
    }
    pcStack_1c0 = (code *)0x1112a9;
    secp256k1_fe_sqr((secp256k1_fe *)local_1a8,&local_118);
    psVar45 = &local_60;
    pcStack_1c0 = (code *)0x1112bf;
    secp256k1_fe_mul(psVar45,(secp256k1_fe *)local_1a8,&local_118);
    pcStack_1c0 = (code *)0x1112c7;
    secp256k1_fe_verify(psVar45);
    local_60.n[0] = local_60.n[0] + 2;
    local_60.magnitude = local_60.magnitude + 1;
    local_60.normalized = 0;
    pcStack_1c0 = (code *)0x1112e0;
    secp256k1_fe_verify(psVar45);
    t = &local_e8;
    local_e8.n[4] = CONCAT44(local_60.n[4]._4_4_,(undefined4)local_60.n[4]);
    local_e8.magnitude = local_60.magnitude;
    local_e8.normalized = local_60.normalized;
    local_e8.n[2] = local_60.n[2];
    local_e8.n[3] = local_60.n[3];
    local_e8.n[1] = local_60.n[1];
    local_e8.n[0] = local_60.n[0];
    pcStack_1c0 = (code *)0x11130d;
    secp256k1_fe_verify(t);
    psVar44 = &local_148;
    pcStack_1c0 = (code *)0x11131a;
    secp256k1_fe_verify(psVar44);
    if (local_148.magnitude + local_e8.magnitude < 0x21) break;
    pcStack_1c0 = (code *)0x111878;
    secp256k1_ellswift_xswiftec_frac_var_cold_7();
LAB_00111878:
    local_118.n[4] = 0;
    local_118.magnitude = 1;
    local_118.normalized = 1;
    local_118.n[2] = 0;
    local_118.n[3] = 0;
    local_118.n[0] = 1;
    local_118.n[1] = 0;
  }
  local_a8 = local_e8.n[0] + local_148.n[0];
  uStack_a0 = local_e8.n[1] + local_148.n[1];
  local_e8.n[2] = local_e8.n[2] + local_148.n[2];
  local_e8.n[3] = local_e8.n[3] + local_148.n[3];
  uVar22 = local_e8.n[4] + local_148.n[4];
  local_e8.normalized = 0;
  pcStack_1c0 = (code *)0x11138f;
  local_e8.n[4] = uVar22;
  local_e8.magnitude = local_148.magnitude + local_e8.magnitude;
  local_b8 = local_e8.n[2];
  uStack_b0 = local_e8.n[3];
  local_e8.n[0] = local_a8;
  local_e8.n[1] = uStack_a0;
  secp256k1_fe_verify(&local_e8);
  pcStack_1c0 = (code *)0x111397;
  secp256k1_fe_verify(&local_e8);
  uVar12 = local_a8 + (uVar22 >> 0x30) * 0x1000003d1;
  if (((uVar12 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar12 & 0xfffffffffffff) == 0)) {
    uVar32 = uStack_a0 + (uVar12 >> 0x34);
    uVar37 = local_b8 + (uVar32 >> 0x34);
    uVar33 = uStack_b0 + (uVar37 >> 0x34);
    uVar22 = (uVar33 >> 0x34) + (uVar22 & 0xffffffffffff);
    in_R8 = (uVar32 | uVar12 | uVar37 | uVar33) & 0xfffffffffffff | uVar22;
    if (in_R8 == 0) goto LAB_001118de;
    in_R8 = 0x1000003d0;
    if (((uVar12 | 0x1000003d0) & uVar32 & uVar37 & uVar33 & (uVar22 ^ 0xf000000000000)) ==
        0xfffffffffffff) goto LAB_001118de;
  }
  while( true ) {
    pcStack_1c0 = (code *)0x111489;
    secp256k1_fe_mul(&local_90,&local_148,(secp256k1_fe *)local_1a8);
    pcStack_1c0 = (code *)0x111491;
    secp256k1_fe_verify(&local_90);
    if (local_90.magnitude < 0xb) break;
    pcStack_1c0 = (code *)0x1118de;
    secp256k1_ellswift_xswiftec_frac_var_cold_6();
LAB_001118de:
    pcStack_1c0 = (code *)0x1118f8;
    secp256k1_ellswift_xswiftec_frac_var_cold_1();
  }
  local_90.magnitude = local_90.magnitude * 3;
  psVar45 = &local_90;
  local_90.n[0] = local_90.n[0] * 3;
  local_90.n[1] = local_90.n[1] * 3;
  local_90.n[2] = local_90.n[2] * 3;
  local_90.n[3] = local_90.n[3] * 3;
  psVar48 = (secp256k1_scalar *)(local_90.n[4] * 3);
  local_90.normalized = 0;
  pcStack_1c0 = (code *)0x1114f7;
  local_90.n[4] = (uint64_t)psVar48;
  secp256k1_fe_verify(psVar45);
  pcStack_1c0 = (code *)0x11150c;
  secp256k1_fe_sqr((secp256k1_fe *)local_1a8,&local_e8);
  pcStack_1c0 = (code *)0x111514;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  pcStack_1c0 = (code *)0x111523;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)(local_1a8._40_8_ & 0xffffffff),1);
  local_1a8._0_8_ = 0x3ffffbfffff0bc - local_1a8._0_8_;
  local_1a8._8_8_ = 0x3ffffffffffffc - local_1a8._8_8_;
  local_1a8._16_8_ = 0x3ffffffffffffc - local_1a8._16_8_;
  local_1a8._24_8_ = 0x3ffffffffffffc - local_1a8._24_8_;
  local_1a8._32_8_ = 0x3fffffffffffc - local_1a8._32_8_;
  local_1a8._40_4_ = 2;
  local_1a8._44_4_ = 0;
  pcStack_1c0 = (code *)0x111572;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  psVar44 = (secp256k1_fe *)(local_1a8 + 0x30);
  pcStack_1c0 = (code *)0x11158a;
  a_00 = psVar45;
  secp256k1_fe_mul(psVar44,psVar45,&local_118);
  pcStack_1c0 = (code *)0x111592;
  secp256k1_fe_verify(psVar44);
  pcStack_1c0 = (code *)0x11159a;
  psVar34 = (secp256k1_gej *)local_1a8;
  secp256k1_fe_verify((secp256k1_fe *)local_1a8);
  if ((int)(local_1a8._40_4_ + uStack_150) < 0x21) {
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168._8_8_ = local_168._8_8_ + local_1a8._24_8_;
    local_168._0_8_ = local_168._0_8_ + local_1a8._16_8_;
    local_158 = local_158 + local_1a8._32_8_;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x1115f0;
    psVar48 = (secp256k1_scalar *)local_1a8._32_8_;
    uStack_150 = local_1a8._40_4_ + uStack_150;
    secp256k1_fe_verify((secp256k1_fe *)(local_1a8 + 0x30));
    pcStack_1c0 = (code *)0x111600;
    iVar8 = secp256k1_ge_x_frac_on_curve_var((secp256k1_fe *)(local_1a8 + 0x30),&local_90);
    if (iVar8 != 0) {
      (local_1b0->x).n[4] = local_158;
      (local_1b0->x).magnitude = uStack_150;
      (local_1b0->x).normalized = iStack_14c;
      (local_1b0->x).n[2] = local_168._0_8_;
      (local_1b0->x).n[3] = local_168._8_8_;
      (local_1b0->x).n[0] = local_1a8._48_8_;
      (local_1b0->x).n[1] = uStack_170;
      xd->n[4] = local_90.n[4];
      xd->magnitude = local_90.magnitude;
      xd->normalized = local_90.normalized;
      xd->n[2] = local_90.n[2];
      xd->n[3] = local_90.n[3];
      xd->n[0] = local_90.n[0];
      xd->n[1] = local_90.n[1];
      return;
    }
    auVar2._8_8_ = local_e8.n[3];
    auVar2._0_8_ = local_e8.n[2];
    *(undefined4 *)(xd->n + 4) = (undefined4)local_e8.n[4];
    *(undefined4 *)((long)xd->n + 0x24) = local_e8.n[4]._4_4_;
    xd->magnitude = local_e8.magnitude;
    xd->normalized = local_e8.normalized;
    *(undefined1 (*) [16])(xd->n + 2) = auVar2;
    xd->n[0] = local_e8.n[0];
    xd->n[1] = local_e8.n[1];
    xd = (secp256k1_fe *)local_1a8;
    pcStack_1c0 = (code *)0x111691;
    secp256k1_fe_mul(xd,&secp256k1_ellswift_c1,&local_148);
    a_00 = &secp256k1_ellswift_c2;
    psVar45 = (secp256k1_fe *)(local_1a8 + 0x30);
    pcStack_1c0 = (code *)0x1116ad;
    secp256k1_fe_mul(psVar45,&secp256k1_ellswift_c2,&local_60);
    pcStack_1c0 = (code *)0x1116b5;
    secp256k1_fe_verify(psVar45);
    pcStack_1c0 = (code *)0x1116bd;
    psVar34 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    if (0x20 < (int)(local_1a8._40_4_ + uStack_150)) goto LAB_00111902;
    psVar45 = (secp256k1_fe *)(local_1a8 + 0x30);
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168._0_8_ = local_168._0_8_ + local_1a8._16_8_;
    local_168._8_8_ = local_168._8_8_ + local_1a8._24_8_;
    local_158 = local_158 + local_1a8._32_8_;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x111712;
    psVar48 = (secp256k1_scalar *)local_1a8._32_8_;
    uStack_150 = local_1a8._40_4_ + uStack_150;
    secp256k1_fe_verify(psVar45);
    pcStack_1c0 = (code *)0x111725;
    secp256k1_fe_mul(psVar45,psVar45,&local_118);
    pcStack_1c0 = (code *)0x111735;
    iVar8 = secp256k1_ge_x_frac_on_curve_var(psVar45,&local_e8);
    if (iVar8 != 0) {
      (local_1b0->x).n[4] = local_158;
      (local_1b0->x).magnitude = uStack_150;
      (local_1b0->x).normalized = iStack_14c;
      (local_1b0->x).n[2] = local_168._0_8_;
      (local_1b0->x).n[3] = local_168._8_8_;
      (local_1b0->x).n[0] = local_1a8._48_8_;
      (local_1b0->x).n[1] = uStack_170;
      return;
    }
    xd = (secp256k1_fe *)local_1a8;
    a_00 = &local_e8;
    pcStack_1c0 = (code *)0x11177e;
    secp256k1_fe_mul(xd,a_00,&local_118);
    psVar45 = (secp256k1_fe *)(local_1a8 + 0x30);
    pcStack_1c0 = (code *)0x11178b;
    secp256k1_fe_verify(psVar45);
    pcStack_1c0 = (code *)0x111793;
    psVar34 = (secp256k1_gej *)xd;
    secp256k1_fe_verify(xd);
    if (0x20 < (int)(local_1a8._40_4_ + uStack_150)) goto LAB_00111907;
    xd = (secp256k1_fe *)(local_1a8 + 0x30);
    local_1a8._48_8_ = local_1a8._48_8_ + local_1a8._0_8_;
    uStack_170 = uStack_170 + local_1a8._8_8_;
    local_168._0_8_ = local_168._0_8_ + local_1a8._16_8_;
    local_168._8_8_ = local_168._8_8_ + local_1a8._24_8_;
    local_158 = local_158 + local_1a8._32_8_;
    iStack_14c = 0;
    pcStack_1c0 = (code *)0x1117e8;
    psVar48 = (secp256k1_scalar *)local_1a8._32_8_;
    uStack_150 = local_1a8._40_4_ + uStack_150;
    secp256k1_fe_verify(xd);
    pcStack_1c0 = (code *)0x1117f0;
    secp256k1_fe_verify(xd);
    pcStack_1c0 = (code *)0x1117fe;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)uStack_150,2);
    psVar25 = local_1b0;
    (local_1b0->x).n[0] = 0x5ffff9ffffe91a - local_1a8._48_8_;
    (local_1b0->x).n[1] = 0x5ffffffffffffa - uStack_170;
    (local_1b0->x).n[2] = 0x5ffffffffffffa - local_168._0_8_;
    (local_1b0->x).n[3] = 0x5ffffffffffffa - local_168._8_8_;
    (local_1b0->x).n[4] = 0x5fffffffffffa - local_158;
    (local_1b0->x).magnitude = 3;
    (local_1b0->x).normalized = 0;
    pcStack_1c0 = (code *)0x111849;
    secp256k1_fe_verify(&local_1b0->x);
    a_00 = &local_e8;
    pcStack_1c0 = (code *)0x111859;
    psVar34 = psVar25;
    iVar8 = secp256k1_ge_x_frac_on_curve_var(&psVar25->x,a_00);
    if (iVar8 != 0) {
      return;
    }
  }
  else {
    pcStack_1c0 = (code *)0x111902;
    secp256k1_ellswift_xswiftec_frac_var_cold_5();
LAB_00111902:
    pcStack_1c0 = (code *)0x111907;
    secp256k1_ellswift_xswiftec_frac_var_cold_4();
LAB_00111907:
    pcStack_1c0 = (code *)0x11190c;
    secp256k1_ellswift_xswiftec_frac_var_cold_3();
  }
  pcStack_1c0 = secp256k1_ecmult_const_xonly;
  secp256k1_ellswift_xswiftec_frac_var_cold_2();
  pcStack_1c0 = (code *)0xfffffffffffff;
  psVar46 = (secp256k1_gej *)auStack_350;
  pcStack_368 = (code *)0x11193e;
  psStack_1e8 = psVar25;
  psStack_1e0 = (secp256k1_gej *)local_1a8;
  psStack_1d8 = psVar44;
  psStack_1d0 = (secp256k1_gej *)xd;
  psStack_1c8 = psVar45;
  secp256k1_fe_sqr((secp256k1_fe *)psVar46,a_00);
  pcStack_368 = (code *)0x11194c;
  secp256k1_fe_mul((secp256k1_fe *)psVar46,(secp256k1_fe *)psVar46,a_00);
  psStack_358 = psVar34;
  if (a == (secp256k1_fe *)0x0) {
    pcStack_368 = (code *)0x111b04;
    secp256k1_fe_verify((secp256k1_fe *)auStack_350);
    auStack_350._0_8_ = auStack_350._0_8_ + 2;
    iStack_328 = iStack_328 + 1;
    iStack_324 = 0;
    pcStack_368 = (code *)0x111b1a;
    secp256k1_fe_verify((secp256k1_fe *)auStack_350);
    if ((int)in_R8 == 0) {
      psVar14 = (secp256k1_ge *)auStack_350;
LAB_00111b23:
      pcStack_368 = (code *)0x111b28;
      iVar8 = secp256k1_fe_is_square_var(&psVar14->x);
      if (iVar8 == 0) {
        return;
      }
    }
LAB_00111b30:
    psVar34 = (secp256k1_gej *)auStack_350;
    pcStack_368 = (code *)0x111b48;
    secp256k1_fe_mul(&sStack_250.x,(secp256k1_fe *)psVar34,a_00);
    a_00 = &sStack_250.y;
    pcStack_368 = (code *)0x111b5b;
    secp256k1_fe_sqr(a_00,(secp256k1_fe *)psVar34);
    sStack_250.infinity = 0;
    psVar25 = (secp256k1_gej *)(ulong)*psVar48;
    pcStack_368 = (code *)0x111b6c;
    secp256k1_scalar_verify((secp256k1_scalar *)psVar25);
    if (*psVar48 == 0) {
      pcStack_368 = (code *)0x111c1b;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      psVar34 = (secp256k1_gej *)auStack_2f0;
      pcStack_368 = (code *)0x111b8e;
      secp256k1_ecmult_const(psVar34,&sStack_250,psVar48);
      pcStack_368 = (code *)0x111b96;
      psVar25 = psVar34;
      secp256k1_gej_verify(psVar34);
      if (iStack_260 == 0) {
        pcStack_368 = (code *)0x111bb4;
        secp256k1_fe_sqr(&sStack_320,&sStack_290);
        pcStack_368 = (code *)0x111bc4;
        secp256k1_fe_mul(&sStack_320,&sStack_320,(secp256k1_fe *)auStack_350);
        if (a != (secp256k1_fe *)0x0) {
          pcStack_368 = (code *)0x111bd9;
          secp256k1_fe_mul(&sStack_320,&sStack_320,a);
        }
        pcStack_368 = (code *)0x111be9;
        secp256k1_fe_inv(&sStack_320,&sStack_320);
        pcStack_368 = (code *)0x111bfb;
        secp256k1_fe_mul(&psStack_358->x,(secp256k1_fe *)auStack_2f0,&sStack_320);
        return;
      }
    }
    pcStack_368 = (code *)0x111c20;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_00111c20:
    pcStack_368 = (code *)0x111c25;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    pcStack_368 = (code *)0x111962;
    secp256k1_fe_verify(a);
    uVar12 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
    uVar22 = (uVar12 >> 0x34) + a->n[1];
    uVar32 = (uVar22 >> 0x34) + a->n[2];
    psVar25 = (secp256k1_gej *)((uVar32 >> 0x34) + a->n[3]);
    uVar37 = ((ulong)psVar25 >> 0x34) + (a->n[4] & 0xffffffffffff);
    if ((((uVar22 | uVar12 | uVar32 | (ulong)psVar25) & 0xfffffffffffff) == 0 && uVar37 == 0) ||
       (((uVar12 ^ 0x1000003d0) & uVar22 & uVar32 & (ulong)psVar25 & (uVar37 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_00111c20;
    psVar46 = (secp256k1_gej *)auStack_2f0;
    pcStack_368 = (code *)0x111a0e;
    secp256k1_fe_sqr((secp256k1_fe *)psVar46,a);
    pcStack_368 = (code *)0x111a16;
    psVar25 = psVar46;
    secp256k1_fe_verify((secp256k1_fe *)psVar46);
    if (iStack_2c8 < 0x11) {
      psVar46 = (secp256k1_gej *)auStack_2f0;
      auStack_2f0._0_8_ = auStack_2f0._0_8_ * 2;
      auStack_2f0._8_8_ = auStack_2f0._8_8_ * 2;
      uStack_2d8 = uStack_2d8 * 2;
      auStack_2f0._16_8_ = auStack_2f0._16_8_ * 2;
      uStack_2d0 = uStack_2d0 << 1;
      iStack_2c8 = iStack_2c8 * 2;
      iStack_2c4 = 0;
      pcStack_368 = (code *)0x111a62;
      secp256k1_fe_verify((secp256k1_fe *)psVar46);
      pcStack_368 = (code *)0x111a70;
      secp256k1_fe_mul((secp256k1_fe *)psVar46,(secp256k1_fe *)psVar46,a);
      psVar34 = (secp256k1_gej *)auStack_350;
      pcStack_368 = (code *)0x111a7d;
      secp256k1_fe_verify((secp256k1_fe *)psVar34);
      pcStack_368 = (code *)0x111a85;
      psVar25 = psVar46;
      secp256k1_fe_verify((secp256k1_fe *)psVar46);
      if (0x20 < iStack_2c8 + iStack_328) goto LAB_00111c2a;
      auStack_350._0_8_ = auStack_350._0_8_ + auStack_2f0._0_8_;
      auStack_350._8_8_ = auStack_350._8_8_ + auStack_2f0._8_8_;
      auStack_350._16_8_ = auStack_350._16_8_ + auStack_2f0._16_8_;
      uStack_338 = uStack_338 + uStack_2d8;
      uStack_330 = uStack_330 + uStack_2d0;
      iStack_324 = 0;
      pcStack_368 = (code *)0x111ad6;
      iStack_328 = iStack_2c8 + iStack_328;
      secp256k1_fe_verify((secp256k1_fe *)auStack_350);
      if ((int)in_R8 == 0) {
        psVar14 = &sStack_250;
        pcStack_368 = (code *)0x111af2;
        secp256k1_fe_mul(&psVar14->x,(secp256k1_fe *)auStack_350,a);
        goto LAB_00111b23;
      }
      goto LAB_00111b30;
    }
  }
  pcStack_368 = (code *)0x111c2a;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_00111c2a:
  pcStack_368 = secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_380 = (code *)0x111c50;
  psStack_378 = psVar34;
  pcStack_368 = (code *)psVar48;
  secp256k1_fe_verify(&psVar25->x);
  uVar12 = (psVar25->x).n[4];
  uVar22 = (uVar12 >> 0x30) * 0x1000003d1 + (psVar25->x).n[0];
  uVar37 = (uVar22 >> 0x34) + (psVar25->x).n[1];
  uVar32 = (uVar37 >> 0x34) + (psVar25->x).n[2];
  uVar33 = uVar32 & 0xfffffffffffff;
  uVar32 = (uVar32 >> 0x34) + (psVar25->x).n[3];
  uVar12 = (uVar32 >> 0x34) + (uVar12 & 0xffffffffffff);
  uVar22 = uVar22 & 0xfffffffffffff;
  uVar41 = (ulong)(0xffffefffffc2e < uVar22 &&
                  ((uVar33 & uVar37 & uVar32) == 0xfffffffffffff && uVar12 == 0xffffffffffff)) |
           uVar12 >> 0x30;
  uVar22 = uVar41 * 0x1000003d1 + uVar22;
  uVar37 = (uVar22 >> 0x34) + (uVar37 & 0xfffffffffffff);
  psVar34 = (secp256k1_gej *)((uVar37 >> 0x34) + uVar33);
  uVar32 = ((ulong)psVar34 >> 0x34) + (uVar32 & 0xfffffffffffff);
  uVar12 = (uVar32 >> 0x34) + uVar12;
  if ((uint)(ushort)(uVar12 >> 0x30) == (uint)uVar41) {
    (psVar25->x).n[0] = uVar22 & 0xfffffffffffff;
    (psVar25->x).n[1] = uVar37 & 0xfffffffffffff;
    (psVar25->x).n[2] = (ulong)psVar34 & 0xfffffffffffff;
    (psVar25->x).n[3] = uVar32 & 0xfffffffffffff;
    (psVar25->x).n[4] = uVar12 & 0xffffffffffff;
    (psVar25->x).magnitude = 1;
    (psVar25->x).normalized = 1;
    secp256k1_fe_verify(&psVar25->x);
    return;
  }
  pcStack_380 = main;
  secp256k1_fe_normalize_cold_1();
  uStack_388 = 0xfffffffffffff;
  uStack_390 = 0xffffffffffff;
  psStack_3a8 = psVar25;
  psStack_3a0 = a_00;
  psStack_398 = psVar46;
  pcStack_380 = (code *)(in_R8 & 0xffffffff);
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  iVar8 = (int)uVar32;
  psStack_1e68 = (secp256k1_gej *)(uVar32 & 0xffffffff);
  psStack_1e30 = psVar34;
  if (iVar8 < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar12 = strtol((char *)(psVar34->x).n[1],(char **)0x0,0);
    count = (int)uVar12;
    printf("test count = %i\n",uVar12 & 0xffffffff);
    if (iVar8 != 2) {
      pcVar26 = (char *)(psVar34->x).n[2];
      asStack_1530[0].ecmult_gen_ctx.built = 0;
      asStack_1530[0].ecmult_gen_ctx.scalar_offset = 0;
      asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
      if ((pcVar26 != (char *)0x0) && (*pcVar26 != '\0')) {
        lVar47 = 0;
        do {
          psStack_1e68._0_4_ = iVar8;
          if (pcVar26[1] == '\0') goto LAB_00111ec3;
          iVar9 = __isoc99_sscanf(pcVar26,"%2hx",auStack_b60);
          if (iVar9 != 1) goto LAB_00111ec3;
          auStack_1590[lVar47 + 0x60] = auStack_b60[0];
          if (lVar47 == 0xf) goto LAB_00111ec3;
          lVar47 = lVar47 + 1;
          pcVar1 = pcVar26 + 2;
          pcVar26 = pcVar26 + 2;
          if (*pcVar1 == '\0') goto LAB_00111ec3;
        } while( true );
      }
    }
  }
  asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] = 0;
  asStack_1530[0].ecmult_gen_ctx.built = 0;
  asStack_1530[0].ecmult_gen_ctx.scalar_offset = 0;
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) &&
     (sVar13 = fread(auStack_1590 + 0x60,1,0x10,__stream), sVar13 == 0x10)) goto LAB_00111ebb;
LAB_00114a9d:
  main_cold_1();
  iVar8 = (int)psStack_1e68;
  if ((extraout_RAX & 1) == 0) {
LAB_00111ebb:
    psStack_1e68._0_4_ = iVar8;
    fclose(__stream);
  }
LAB_00111ec3:
  na = (code *)((ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff);
  lVar47 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xff,
         (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff);
  auStack_b60._0_8_ = 0xbb67ae856a09e667;
  auStack_b60._8_8_ = 0xa54ff53a3c6ef372;
  auStack_b60._16_8_ = 0x9b05688c510e527f;
  auStack_b60._24_8_ = 0x5be0cd191f83d9ab;
  auStack_b60._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_b60,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_b60,auStack_1590 + 0x60,0x10);
  puVar53 = auStack_10b0;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_b60,puVar53);
  psVar25 = psStack_1e30;
  do {
    psVar44 = (secp256k1_fe *)0x0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)puVar53[(long)psVar44] | uVar12 << 8;
      psVar44 = (secp256k1_fe *)((long)psVar44->n + 1);
    } while (psVar44 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar47] = uVar12;
    lVar47 = lVar47 + 1;
    puVar53 = puVar53 + 8;
  } while (lVar47 != 4);
  if (4 < (int)psStack_1e68) {
    lVar47 = strtol((char *)(psStack_1e30->x).n[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar47;
    uVar12 = strtol((char *)(psVar25->x).n[4],(char **)0x0,0);
    this_core = (uint32_t)uVar12;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114ac5:
      main_cold_2();
      return;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar12 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar38 = (secp256k1_context *)0xd0;
  psVar14 = (secp256k1_ge *)malloc(0xd0);
  if (psVar14 == (secp256k1_ge *)0x0) goto LAB_00114b4f;
  psVar38 = (secp256k1_context *)0x130;
  psVar25 = (secp256k1_gej *)malloc(0x130);
  if (psVar25 != (secp256k1_gej *)0x0) {
    psVar38 = (secp256k1_context *)0x130;
    psStack_1e68 = (secp256k1_gej *)malloc(0x130);
    if (psStack_1e68 == (secp256k1_gej *)0x0) goto LAB_00114b59;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_b60);
    uVar24 = 0xff;
    do {
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      if ((uVar24 < 0x20) && ((7U >> (uVar24 & 0x1f) & 1) != 0)) {
        psVar44 = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,&secp256k1_ge_const_g,
                   (secp256k1_fe *)0x0);
      }
      bVar55 = uVar24 != 0;
      uVar24 = uVar24 - 1;
    } while (bVar55);
    psVar38 = (secp256k1_context *)auStack_10b0;
    secp256k1_gej_double_var
              ((secp256k1_gej *)psVar38,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
    iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar38,&secp256k1_ge_const_g);
    if (iVar8 == 0) {
LAB_00114b22:
      main_cold_71();
    }
    else {
      secp256k1_gej_set_infinity((secp256k1_gej *)auStack_10b0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_10b0,(secp256k1_gej *)auStack_10b0,
                 (secp256k1_gej *)auStack_b60,psVar44);
      lVar27 = 0;
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      memcpy(psVar25,(secp256k1_gej *)auStack_b60,0x98);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      secp256k1_gej_add_var
                ((secp256k1_gej *)auStack_10b0,(secp256k1_gej *)auStack_10b0,
                 (secp256k1_gej *)auStack_b60,psVar44);
      secp256k1_gej_double_var
                ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
      memcpy(psVar25 + 1,(secp256k1_gej *)auStack_b60,0x98);
      secp256k1_gej_neg(psStack_1e68,(secp256k1_gej *)auStack_10b0);
      secp256k1_gej_add_var(psStack_1e68 + 1,psStack_1e68,psVar25,psVar44);
      secp256k1_gej_verify(psStack_1e68);
      secp256k1_gej_verify(psStack_1e68 + 1);
      lVar47 = -1;
      bVar55 = true;
      do {
        bVar23 = bVar55;
        if (psStack_1e68[lVar27].infinity == 0) {
          psVar39 = psVar14 + lVar27;
          if (lVar47 == -1) {
            uVar40 = psStack_1e68[lVar27].z.n[0];
            uVar29 = psStack_1e68[lVar27].z.n[1];
            auVar2 = *(undefined1 (*) [16])(psStack_1e68[lVar27].z.n + 2);
            uVar18 = *(undefined4 *)((long)psStack_1e68[lVar27].z.n + 0x24);
            iVar8 = psStack_1e68[lVar27].z.magnitude;
            iVar9 = psStack_1e68[lVar27].z.normalized;
            *(int *)((psVar39->x).n + 4) = (int)psStack_1e68[lVar27].z.n[4];
            *(undefined4 *)((long)(psVar39->x).n + 0x24) = uVar18;
            (psVar39->x).magnitude = iVar8;
            (psVar39->x).normalized = iVar9;
            *(undefined1 (*) [16])((psVar39->x).n + 2) = auVar2;
            (psVar39->x).n[0] = uVar40;
            (psVar39->x).n[1] = uVar29;
            lVar47 = lVar27;
          }
          else {
            secp256k1_fe_mul(&psVar39->x,&psVar14[lVar47].x,&psStack_1e68[lVar27].z);
            lVar47 = lVar27;
          }
        }
        else {
          secp256k1_ge_set_infinity(psVar14 + lVar27);
        }
        lVar27 = 1;
        bVar55 = false;
      } while (bVar23);
      if (lVar47 == -1) goto LAB_00112349;
      psVar38 = (secp256k1_context *)auStack_10b0;
      secp256k1_fe_inv_var((secp256k1_fe *)psVar38,&psVar14[lVar47].x);
      if (lVar47 == 0) {
LAB_001122b8:
        lVar47 = 0;
      }
      else if (psStack_1e68->infinity == 0) {
        psVar38 = (secp256k1_context *)auStack_10b0;
        secp256k1_fe_mul(&psVar14[lVar47].x,(secp256k1_fe *)psVar14,(secp256k1_fe *)psVar38);
        secp256k1_fe_mul((secp256k1_fe *)psVar38,(secp256k1_fe *)psVar38,&psStack_1e68[lVar47].z);
        goto LAB_001122b8;
      }
      if (psStack_1e68[lVar47].infinity == 0) {
        puVar36 = psVar14[lVar47].x.n + 4;
        *(undefined4 *)puVar36 = uStack_1090;
        *(undefined4 *)((long)puVar36 + 4) = uStack_108c;
        *(int *)(puVar36 + 1) = iStack_1088;
        *(int *)((long)puVar36 + 0xc) = iStack_1084;
        *(undefined1 (*) [16])(psVar14[lVar47].x.n + 2) = auStack_10b0._16_16_;
        psVar14[lVar47].x.n[0] = auStack_10b0._0_8_;
        psVar14[lVar47].x.n[1] = auStack_10b0._8_8_;
        lVar47 = 0;
        bVar55 = true;
        do {
          bVar23 = bVar55;
          if (psStack_1e68[lVar47].infinity == 0) {
            secp256k1_ge_set_gej_zinv(psVar14 + lVar47,psStack_1e68 + lVar47,&psVar14[lVar47].x);
          }
          lVar47 = 1;
          bVar55 = false;
        } while (bVar23);
        secp256k1_ge_verify(psVar14);
        secp256k1_ge_verify(psVar14 + 1);
LAB_00112349:
        lVar47 = 0;
        bVar55 = true;
LAB_0011235a:
        psVar15 = (secp256k1_context *)(psVar14 + lVar47);
        psVar38 = psVar15;
        secp256k1_ge_verify((secp256k1_ge *)psVar15);
        if (psVar14[lVar47].infinity == 0) goto code_r0x00112376;
        main_cold_4();
LAB_00114adc:
        main_cold_53();
LAB_00114ae1:
        main_cold_5();
LAB_00114ae6:
        main_cold_6();
LAB_00114aeb:
        main_cold_69();
LAB_00114af0:
        main_cold_68();
LAB_00114af5:
        main_cold_67();
LAB_00114afa:
        main_cold_7();
LAB_00114aff:
        main_cold_8();
LAB_00114b04:
        main_cold_61();
LAB_00114b09:
        main_cold_60();
LAB_00114b0e:
        main_cold_59();
LAB_00114b13:
        main_cold_58();
LAB_00114b18:
        main_cold_50();
LAB_00114b1d:
        main_cold_56();
        goto LAB_00114b22;
      }
    }
    main_cold_3();
LAB_00114b2c:
    main_cold_55();
LAB_00114b31:
    main_cold_54();
LAB_00114b36:
    main_cold_52();
LAB_00114b3b:
    main_cold_51();
    goto LAB_00114b40;
  }
  goto LAB_00114b54;
code_r0x00112376:
  secp256k1_ge_to_storage(secp256k1_ecmult_gen_prec_table[0] + lVar47,(secp256k1_ge *)psVar15);
  lVar47 = 1;
  bVar23 = !bVar55;
  bVar55 = false;
  if (bVar23) goto code_r0x00112398;
  goto LAB_0011235a;
LAB_00114a80:
  main_cold_64();
LAB_00114a85:
  main_cold_63();
LAB_00114a8a:
  main_cold_62();
  goto LAB_00114a9d;
code_r0x00112398:
  free(psStack_1e68);
  free(psVar25);
  free(psVar14);
  secp256k1_gej_set_ge((secp256k1_gej *)auStack_b60,&secp256k1_ge_const_g);
  secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_b60,gen);
  iVar8 = 0x80;
  do {
    secp256k1_gej_double_var
              ((secp256k1_gej *)auStack_b60,(secp256k1_gej *)auStack_b60,(secp256k1_fe *)0x0);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_b60,gen_00);
  iVar8 = count;
  while( true ) {
    count = iVar8 + -1;
    if (iVar8 == 0) {
      testrand256(auStack_1590 + 0x60);
      printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
             asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 8 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x10 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x18 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x20 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x28 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x30 & 0xff,
             (ulong)asStack_1530[0].ecmult_gen_ctx._0_8_ >> 0x38,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 8 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x10 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x18 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x20 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x28 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x30 & 0xff,
             asStack_1530[0].ecmult_gen_ctx.ge_offset.x.n[0] >> 0x38);
      puts("no problems found");
      return;
    }
    psVar25 = (secp256k1_gej *)(auStack_1590 + 0x60);
    psVar15 = secp256k1_context_create(1);
    testrand256(auStack_1b50);
    psVar38 = psVar15;
    iVar8 = secp256k1_context_randomize(psVar15,auStack_1b50);
    if (iVar8 == 0) break;
    psStack_1d68 = psVar15;
    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_b60);
    secp256k1_ge_set_gej((secp256k1_ge *)auStack_10b0,(secp256k1_gej *)auStack_b60);
    lVar47 = -0x4e0;
    uVar24 = 1;
    psVar34 = (secp256k1_gej *)auStack_b60;
    do {
      psVar46 = psVar34 + 1;
      secp256k1_gej_add_ge(psVar46,psVar34,&secp256k1_ge_const_g);
      secp256k1_ge_set_gej((secp256k1_ge *)(auStack_b68 + lVar47),psVar46);
      if (count != 0) {
        testutil_random_fe((secp256k1_fe *)psVar25);
        secp256k1_gej_rescale(psVar46,(secp256k1_fe *)psVar25);
      }
      auStack_1830._0_4_ = uVar24;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      secp256k1_ecmult_gen(&psVar15->ecmult_gen_ctx,psVar25,(secp256k1_scalar *)auStack_1830);
      psVar38 = (secp256k1_context *)auStack_1b30;
      secp256k1_ge_set_gej((secp256k1_ge *)psVar38,psVar25);
      if (*(int *)(auStack_b60 + lVar47 + 0x58) != 0) goto LAB_00114ae1;
      if (iStack_1ad0 != 0) goto LAB_00114ae6;
      psVar38 = (secp256k1_context *)auStack_1b30;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar38,(secp256k1_fe *)(auStack_b68 + lVar47));
      if (iVar8 == 0) goto LAB_00114aeb;
      psVar38 = (secp256k1_context *)(auStack_1b30 + 0x30);
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar38,
                                 (secp256k1_fe *)(auStack_b60 + lVar47 + 0x28));
      if (iVar8 == 0) goto LAB_00114af0;
      uVar24 = uVar24 + 1;
      lVar47 = lVar47 + 0x68;
      psVar34 = psVar46;
    } while (lVar47 != 0);
    uVar12 = 0;
    puVar51 = auStack_10b0;
    lVar47 = 0;
    do {
      psVar38 = (secp256k1_context *)(puVar51 + (uVar12 / 0xd) * -0x548);
      secp256k1_ge_mul_lambda((secp256k1_ge *)psVar25,(secp256k1_ge *)(auStack_10b0 + lVar47));
      iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar38,(secp256k1_ge *)psVar25);
      if (iVar8 == 0) goto LAB_00114af5;
      lVar47 = lVar47 + 0x68;
      puVar51 = puVar51 + 0x3a8;
      uVar12 = uVar12 + 9;
    } while (lVar47 != 0x548);
    psVar38 = (secp256k1_context *)auStack_10b0;
    secp256k1_ge_verify((secp256k1_ge *)psVar38);
    if (aiStack_1058[2] == 0) goto LAB_00114b45;
    psVar38 = (secp256k1_context *)auStack_b60;
    secp256k1_gej_verify((secp256k1_gej *)psVar38);
    if (auStack_b60._144_4_ == 0) goto LAB_00114b4a;
    lVar47 = 0xc;
    psVar50 = asStack_1048;
    a_01 = (secp256k1_context *)(auStack_b60 + 0x98);
    do {
      psVar38 = psVar50;
      secp256k1_ge_verify((secp256k1_ge *)psVar50);
      if ((psVar50->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114afa;
      psVar38 = a_01;
      secp256k1_gej_verify((secp256k1_gej *)a_01);
      if ((int)(a_01->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114aff;
      a_01 = (secp256k1_context *)&(a_01->ecmult_gen_ctx).proj_blind.magnitude;
      psVar50 = (secp256k1_context *)&(psVar50->ecmult_gen_ctx).ge_offset.infinity;
      lVar47 = lVar47 + -1;
    } while (lVar47 != 0);
    pFVar28 = (FILE *)auStack_10b0;
    psStack_1e60 = (secp256k1_gej *)0x0;
    uStack_1e48 = 0;
    do {
      if (((ulong)num_cores == 1) ||
         (uStack_1e48 = uStack_1e48 + 0xe7037ed1a0b428db,
         (uint32_t)((uStack_1e48 >> 0x20 ^ uStack_1e48 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
         this_core)) {
        lVar47 = (long)psStack_1e60 * 0x98;
        secp256k1_fe_inv((secp256k1_fe *)auStack_1830,
                         (secp256k1_fe *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 0x60));
        lVar27 = 0;
        __stream = pFVar28;
        psVar25 = psStack_1e60;
        do {
          psVar14 = (secp256k1_ge *)(((ulong)psVar25 / 0xd) * -0x548 + (long)__stream);
          psVar34 = (secp256k1_gej *)(auStack_b60 + lVar27);
          secp256k1_gej_add_var
                    ((secp256k1_gej *)(auStack_1590 + 0x60),psVar34,
                     (secp256k1_gej *)(auStack_b60 + (long)psStack_1e60 * 0x98),
                     (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar14);
          if (iVar8 == 0) goto LAB_00114a80;
          if (psStack_1e60 != (secp256k1_gej *)0x0) {
            secp256k1_gej_add_ge
                      ((secp256k1_gej *)(auStack_1590 + 0x60),psVar34,
                       (secp256k1_ge *)(auStack_10b0 + (long)psStack_1e60 * 0x68));
            iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar14);
            if (iVar8 == 0) {
              main_cold_9();
              goto LAB_00114ac5;
            }
          }
          secp256k1_gej_add_ge_var
                    ((secp256k1_gej *)(auStack_1590 + 0x60),psVar34,
                     (secp256k1_ge *)(auStack_10b0 + (long)psStack_1e60 * 0x68),(secp256k1_fe *)0x0)
          ;
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar14);
          psStack_1e68 = psVar25;
          if (iVar8 == 0) goto LAB_00114a85;
          iStack_1ad0 = *(int *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 0x90);
          auStack_1b30._32_8_ = *(uint64_t *)(auStack_b60 + lVar47 + 0x20);
          auStack_1b30._40_7_ = (undefined7)*(undefined8 *)(auStack_b60 + lVar47 + 0x28);
          auStack_1b30[0x2f] = (uchar)((ulong)*(undefined8 *)(auStack_b60 + lVar47 + 0x28) >> 0x38);
          auStack_1b30._16_8_ = *(uint64_t *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 0x10);
          auStack_1b30._24_7_ = (undefined7)*(undefined8 *)(auStack_b60 + lVar47 + 0x18);
          auStack_1b30[0x1f] = (uchar)((ulong)*(undefined8 *)(auStack_b60 + lVar47 + 0x18) >> 0x38);
          auStack_1b30._0_8_ =
               (((secp256k1_gej *)(auStack_b60 + (long)psStack_1e60 * 0x98))->x).n[0];
          auStack_1b30._8_7_ =
               (undefined7)*(undefined8 *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 8);
          auStack_1b30[0xf] =
               (uchar)((ulong)*(undefined8 *)(auStack_b60 + (long)psStack_1e60 * 0x98 + 8) >> 0x38);
          auStack_1b30._48_8_ = *(undefined8 *)(auStack_b60 + lVar47 + 0x30);
          auStack_1af0 = *(undefined1 (*) [16])(auStack_b60 + lVar47 + 0x40);
          uStack_1ae0 = *(undefined4 *)(auStack_b60 + lVar47 + 0x50);
          uStack_1adc = *(undefined4 *)(auStack_b60 + lVar47 + 0x54);
          iStack_1ad8 = *(int *)(auStack_b60 + lVar47 + 0x58);
          iStack_1ad4 = *(int *)(auStack_b60 + lVar47 + 0x5c);
          auStack_1af8._0_7_ = (undefined7)*(undefined8 *)(auStack_b60 + lVar47 + 0x38);
          auStack_1af8[7] = (uchar)((ulong)*(undefined8 *)(auStack_b60 + lVar47 + 0x38) >> 0x38);
          secp256k1_gej_add_zinv_var
                    ((secp256k1_gej *)(auStack_1590 + 0x60),psVar34,(secp256k1_ge *)auStack_1b30,
                     (secp256k1_fe *)auStack_1830);
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)(auStack_1590 + 0x60),psVar14);
          if (iVar8 == 0) goto LAB_00114a8a;
          lVar27 = lVar27 + 0x98;
          __stream = (FILE *)&__stream->_chain;
          psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + 1);
        } while (lVar27 != 0x7b8);
      }
      psVar50 = (secp256k1_context *)(auStack_1590 + 0x60);
      psStack_1e60 = (secp256k1_gej *)((long)(psStack_1e60->x).n + 1);
      pFVar28 = (FILE *)&pFVar28->_chain;
    } while (psStack_1e60 != (secp256k1_gej *)0xd);
    psVar25 = (secp256k1_gej *)auStack_b60;
    uVar24 = 0;
    uVar12 = 0;
    do {
      secp256k1_gej_double((secp256k1_gej *)psVar50,psVar25);
      uVar19 = uVar24 - 0xd;
      if (uVar12 < 7) {
        uVar19 = uVar24;
      }
      psVar38 = psVar50;
      iVar8 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)psVar50,
                         (secp256k1_ge *)(auStack_10b0 + (ulong)uVar19 * 0x68));
      if (iVar8 == 0) goto LAB_00114b04;
      secp256k1_gej_double_var((secp256k1_gej *)psVar50,psVar25,(secp256k1_fe *)0x0);
      psVar38 = psVar50;
      iVar8 = secp256k1_gej_eq_ge_var
                        ((secp256k1_gej *)psVar50,
                         (secp256k1_ge *)(auStack_10b0 + (ulong)uVar19 * 0x68));
      if (iVar8 == 0) goto LAB_00114b09;
      uVar12 = uVar12 + 1;
      uVar24 = uVar24 + 2;
      psVar25 = psVar25 + 1;
    } while (uVar12 != 0xd);
    lVar47 = 0x68;
    psVar14 = &sStack_bd0;
    psVar25 = (secp256k1_gej *)(auStack_b60 + 0x98);
    do {
      psVar38 = (secp256k1_context *)auStack_1b30;
      secp256k1_ge_neg((secp256k1_ge *)psVar38,(secp256k1_ge *)(auStack_10b0 + lVar47));
      iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar38,psVar14);
      if (iVar8 == 0) goto LAB_00114b0e;
      secp256k1_gej_neg((secp256k1_gej *)psVar50,psVar25);
      psVar38 = psVar50;
      iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar50,psVar14);
      if (iVar8 == 0) goto LAB_00114b13;
      lVar47 = lVar47 + 0x68;
      psVar25 = psVar25 + 1;
      psVar14 = psVar14 + -1;
    } while (lVar47 != 0x548);
    lVar47 = 1;
    psStack_1e50 = (secp256k1_scalar *)0x68;
    uStack_1e48 = 0;
    do {
      psStack_1e68 = (secp256k1_gej *)0x0;
      pFVar28 = (FILE *)auStack_10b0;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1e48 = uStack_1e48 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1e48 >> 0x20 ^ uStack_1e48 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          uVar24 = 0;
          __stream = pFVar28;
          psVar25 = psStack_1e68;
          do {
            auStack_1db0._0_4_ = uVar24;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            auStack_1de0._0_4_ = (int)psStack_1e68;
            secp256k1_scalar_verify((secp256k1_scalar *)psStack_1e68);
            auStack_1e20._8_8_ = auStack_1b30;
            auStack_1e20._0_8_ = auStack_1830;
            auStack_1e10._0_8_ = auStack_1590 + 0x60;
            na = (code *)auStack_1db0;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)auStack_1e20,(secp256k1_gej *)auStack_1cd0,1,
                       (secp256k1_gej *)(auStack_b60 + lVar47 * 0x98),(secp256k1_scalar *)na,
                       (secp256k1_scalar *)auStack_1de0);
            iVar8 = secp256k1_gej_eq_ge_var
                              ((secp256k1_gej *)auStack_1cd0,
                               (secp256k1_ge *)(((ulong)psVar25 / 0xd) * -0x548 + (long)__stream));
            if (iVar8 == 0) {
              main_cold_57();
              goto LAB_00114a80;
            }
            uVar24 = uVar24 + 1;
            __stream = (FILE *)((long)&__stream->_flags + (long)psStack_1e50);
            psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + lVar47);
          } while (uVar24 != 0xd);
        }
        psVar50 = (secp256k1_context *)(auStack_1590 + 0x60);
        psStack_1e68 = (secp256k1_gej *)((long)(psStack_1e68->x).n + 1);
        pFVar28 = (FILE *)&pFVar28->_chain;
      } while ((int)psStack_1e68 != 0xd);
      lVar47 = lVar47 + 1;
      psStack_1e50 = (secp256k1_scalar *)((long)psStack_1e50 + 0x68);
    } while (lVar47 != 0xd);
    uVar12 = 0;
    do {
      lVar47 = 0;
      do {
        if (((ulong)num_cores == 1) ||
           (uStack_1e48 = uStack_1e48 + 0xe7037ed1a0b428db,
           (uint32_t)((uStack_1e48 >> 0x20 ^ uStack_1e48 & 0xffffffff) * (ulong)num_cores >> 0x20)
           == this_core)) {
          auStack_1e20._0_4_ = (int)uVar12;
          secp256k1_scalar_verify((secp256k1_scalar *)(uVar12 & 0xffffffff));
          psVar14 = (secp256k1_ge *)(auStack_10b0 + lVar47 * 0x68);
          secp256k1_ecmult_const((secp256k1_gej *)psVar50,psVar14,(secp256k1_scalar *)auStack_1e20);
          uVar24 = (int)lVar47 * (int)uVar12;
          psVar39 = (secp256k1_ge *)
                    (auStack_10b0 + (ulong)(uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc)) * 0x68);
          psVar38 = psVar50;
          iVar8 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar50,psVar39);
          if (iVar8 == 0) goto LAB_00114b1d;
          if (lVar47 != 0 && uVar12 != 0) {
            psVar38 = (secp256k1_context *)auStack_1cd0;
            iVar8 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)psVar14,
                               (secp256k1_fe *)0x0,(secp256k1_scalar *)auStack_1e20,0);
            if (iVar8 == 0) goto LAB_00114b2c;
            psVar38 = (secp256k1_context *)auStack_1cd0;
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)psVar39);
            if (iVar8 == 0) goto LAB_00114b31;
            do {
              testutil_random_fe((secp256k1_fe *)auStack_1830);
              psVar38 = (secp256k1_context *)auStack_1830;
              secp256k1_fe_verify((secp256k1_fe *)auStack_1830);
              if (iStack_1804 == 0) goto LAB_00114adc;
            } while ((SUB168(auStack_1820 | auStack_1830,8) == 0 &&
                     SUB168(auStack_1820 | auStack_1830,0) == 0) &&
                     CONCAT44(auStack_180c,auStack_1810) == 0);
            secp256k1_fe_mul((secp256k1_fe *)auStack_1b30,(secp256k1_fe *)auStack_1830,
                             (secp256k1_fe *)psVar14);
            na = (code *)0x0;
            psVar38 = (secp256k1_context *)auStack_1cd0;
            iVar8 = secp256k1_ecmult_const_xonly
                              ((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)auStack_1b30,
                               (secp256k1_fe *)auStack_1830,(secp256k1_scalar *)auStack_1e20,0);
            if (iVar8 == 0) goto LAB_00114b36;
            psVar38 = (secp256k1_context *)auStack_1cd0;
            iVar8 = secp256k1_fe_equal((secp256k1_fe *)auStack_1cd0,(secp256k1_fe *)psVar39);
            if (iVar8 == 0) goto LAB_00114b3b;
          }
        }
        lVar47 = lVar47 + 1;
      } while (lVar47 != 0xd);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0xd);
    psVar38 = (secp256k1_context *)malloc(0x1020);
    if (psVar38 == (secp256k1_context *)0x0) {
      (*(psVar15->error_callback).fn)("Out of memory",(psVar15->error_callback).data);
    }
    else {
      (psVar38->ecmult_gen_ctx).ge_offset.x.n[1] = 0;
      (psVar38->ecmult_gen_ctx).built = 0x61726373;
      (psVar38->ecmult_gen_ctx).scalar_offset = 0x686374;
      (psVar38->ecmult_gen_ctx).ge_offset.x.n[0] =
           (uint64_t)((psVar38->ecmult_gen_ctx).ge_offset.x.n + 3);
      (psVar38->ecmult_gen_ctx).ge_offset.x.n[2] = 0x1000;
    }
    psStack_1d68 = (secp256k1_context *)&psStack_1d68->error_callback;
    p_Stack_1d80 = (_func_void_char_ptr_void_ptr *)0x0;
    uStack_1d58 = 0;
    psStack_1d50 = psVar38;
    do {
      p_Stack_1d70 = (_func_void_char_ptr_void_ptr *)0x0;
      do {
        psStack_1d78 = (secp256k1_scalar *)0x0;
        do {
          uVar40 = 0;
          psVar50 = psVar38;
          do {
            if (((ulong)num_cores == 1) ||
               (uStack_1d58 = uStack_1d58 + 0xe7037ed1a0b428db, psVar38 = psVar50,
               (uint32_t)
               ((uStack_1d58 >> 0x20 ^ uStack_1d58 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
               this_core)) {
              p_Stack_1d10 = (_func_void_char_ptr_void_ptr *)(auStack_10b0 + uVar40 * 0x68);
              psStack_1d18 = (secp256k1_scalar *)(uVar40 * (long)p_Stack_1d80 + (long)psStack_1d78);
              uVar29 = 0;
              uStack_1d20 = uVar40;
              do {
                asStack_1530[0].ecmult_gen_ctx.built = (int)p_Stack_1d80;
                secp256k1_scalar_verify((secp256k1_scalar *)p_Stack_1d80);
                asStack_1530[0].ecmult_gen_ctx.scalar_offset = (int)p_Stack_1d70;
                secp256k1_scalar_verify((secp256k1_scalar *)p_Stack_1d70);
                auStack_1db0._0_4_ = (int)psStack_1d78;
                secp256k1_scalar_verify(psStack_1d78);
                p_Var35 = p_Stack_1d10;
                psVar14 = &asStack_1530[0].ecmult_gen_ctx.ge_offset;
                for (lVar47 = 0xd; lVar47 != 0; lVar47 = lVar47 + -1) {
                  (psVar14->x).n[0] = *(undefined8 *)p_Var35;
                  p_Var35 = p_Var35 + (ulong)bVar56 * -0x10 + 8;
                  psVar14 = (secp256k1_ge *)((long)psVar14 + ((ulong)bVar56 * -2 + 1) * 8);
                }
                puVar36 = (uint64_t *)(auStack_10b0 + uVar29 * 0x68);
                psVar44 = &asStack_1530[0].ecmult_gen_ctx.proj_blind;
                for (pvVar21 = (void *)0xd; pvVar21 != (void *)0x0;
                    pvVar21 = (void *)((long)pvVar21 + -1)) {
                  psVar44->n[0] = *puVar36;
                  puVar36 = puVar36 + (ulong)bVar56 * -2 + 1;
                  psVar44 = (secp256k1_fe *)((long)psVar44 + ((ulong)bVar56 * -2 + 1) * 8);
                }
                secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1830);
                if (psVar50 == (secp256k1_context *)0x0) {
LAB_00113334:
                  secp256k1_ecmult_multi_simple_var
                            ((secp256k1_gej *)auStack_1830,(secp256k1_scalar *)auStack_1db0,
                             (secp256k1_ecmult_multi_callback *)(auStack_1590 + 0x60),pvVar21,
                             (size_t)na);
                }
                else {
                  lVar47 = 0;
                  do {
                    if (*(char *)((long)(psVar50->ecmult_gen_ctx).ge_offset.x.n + lVar47 + -8) !=
                        "scratch"[lVar47]) {
                      (*(psVar15->error_callback).fn)
                                ("invalid scratch space",(psVar15->error_callback).data);
                      uVar12 = 0;
                      goto LAB_00112f7d;
                    }
                    lVar47 = lVar47 + 1;
                  } while (lVar47 != 8);
                  uVar22 = (psVar50->ecmult_gen_ctx).ge_offset.x.n[2] -
                           (psVar50->ecmult_gen_ctx).ge_offset.x.n[1];
                  uVar12 = 0;
                  if (0x59 < uVar22) {
                    uVar12 = uVar22 - 0x5a;
                  }
LAB_00112f7d:
                  pvVar21 = (void *)0x1;
                  na = (code *)&DAT_00122690;
                  uVar22 = 0;
                  do {
                    if (pvVar21 == (void *)0xd) break;
                    if (pvVar21 < (void *)0xd) {
                      uVar40 = (((secp256k1_gej *)na)->x).n[0];
                    }
                    else {
                      uVar40 = 0;
                    }
                    uVar32 = (ulong)(byte)(0x7f / (byte)((byte)pvVar21 + 1));
                    uVar37 = (0x98L << ((byte)pvVar21 & 0x3f)) + uVar32 * 8 + 0x118;
                    if (uVar12 < uVar37) break;
                    uVar37 = (uVar12 - uVar37) / (uVar32 * 8 + 0x108);
                    uVar32 = uVar37;
                    if (uVar40 <= uVar37) {
                      uVar32 = uVar40;
                    }
                    if (uVar22 < uVar32) {
                      uVar22 = uVar32;
                    }
                    na = (code *)((((secp256k1_gej *)na)->x).n + 1);
                    pvVar21 = (void *)((long)pvVar21 + 1);
                  } while (uVar40 <= uVar37);
                  if (uVar22 == 0) goto LAB_00113334;
                  lVar47 = 0;
                  do {
                    cVar3 = *(char *)((long)(psVar50->ecmult_gen_ctx).ge_offset.x.n + lVar47 + -8);
                    pvVar21 = (void *)CONCAT71((int7)((ulong)pvVar21 >> 8),cVar3);
                    if (cVar3 != "scratch"[lVar47]) {
                      (*(psVar15->error_callback).fn)
                                ("invalid scratch space",(psVar15->error_callback).data);
                      goto LAB_00113334;
                    }
                    lVar47 = lVar47 + 1;
                  } while (lVar47 != 8);
                  uVar12 = (psVar50->ecmult_gen_ctx).ge_offset.x.n[2] -
                           (psVar50->ecmult_gen_ctx).ge_offset.x.n[1];
                  pvVar21 = (void *)0x0;
                  if (0x4a < uVar12) {
                    pvVar21 = (void *)(uVar12 - 0x4b);
                  }
                  if (pvVar21 < (void *)0x70c) goto LAB_00113334;
                  p_Stack_1d00 = (_func_void_char_ptr_void_ptr *)((long)pvVar21 - 0xe18);
                  psStack_1cf0 = (secp256k1_gej *)
                                 (ulong)(p_Stack_1d00 <
                                        (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f4);
                  puStack_1cf8 = (undefined1 *)((long)(psStack_1cf0->x).n + 1);
                  puVar51 = (undefined1 *)0x2;
                  bVar5 = 0;
                  psStack_1e40 = (secp256k1_scalar *)auStack_1db0;
                  lVar47 = 0;
                  uStack_1d48 = uVar29;
                  do {
                    puVar31 = puStack_1cf8;
                    if (puVar51 < puStack_1cf8) {
                      puVar31 = puVar51;
                    }
                    lVar47 = lVar47 << ((byte)psStack_1cf0 & 0x3f);
                    lVar27 = 0;
                    psVar25 = psStack_1cf0;
                    do {
                      cVar3 = *(char *)((long)(psVar50->ecmult_gen_ctx).ge_offset.x.n + lVar27 + -8)
                      ;
                      psVar25 = (secp256k1_gej *)CONCAT71((int7)((ulong)psVar25 >> 8),cVar3);
                      if (cVar3 != "scratch"[lVar27]) {
                        (*(psVar15->error_callback).fn)
                                  ("invalid scratch space",(psVar15->error_callback).data);
                        uStack_1e28 = 0;
                        psVar34 = (secp256k1_gej *)na;
                        goto LAB_001130f7;
                      }
                      lVar27 = lVar27 + 1;
                    } while (lVar27 != 8);
                    uStack_1e28 = (psVar50->ecmult_gen_ctx).ge_offset.x.n[1];
                    psVar34 = (secp256k1_gej *)na;
LAB_001130f7:
                    secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1b30);
                    psVar38 = psStack_1d68;
                    na = (code *)psVar34;
                    if (puVar51 != (undefined1 *)0x0 || psStack_1e40 != (secp256k1_scalar *)0x0) {
                      psStack_1e30 = (secp256k1_gej *)
                                     secp256k1_scratch_alloc
                                               ((secp256k1_callback *)psStack_1d68,
                                                (secp256k1_scratch *)psVar50,(long)puVar31 * 0x98);
                      uVar18 = SUB84(psVar25,0);
                      psStack_1d08 = (secp256k1_gej *)
                                     secp256k1_scratch_alloc
                                               ((secp256k1_callback *)psVar38,
                                                (secp256k1_scratch *)psVar50,(long)puVar31 * 4);
                      pvVar21 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar38,
                                           (secp256k1_scratch *)psVar50,(long)puVar31 * 0xc0);
                      auStack_1e20._0_8_ = pvVar21;
                      pvVar16 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar38,
                                           (secp256k1_scratch *)psVar50,(long)puVar31 * 0x1a0);
                      auStack_1e20._8_8_ = pvVar16;
                      pvVar17 = secp256k1_scratch_alloc
                                          ((secp256k1_callback *)psVar38,
                                           (secp256k1_scratch *)psVar50,(long)puVar31 * 0x410);
                      na = (code *)psStack_1d08;
                      psVar50 = psStack_1d50;
                      auStack_1e10._0_8_ = pvVar17;
                      auVar57._0_4_ =
                           -(uint)((int)psStack_1e30 == 0 && (int)((ulong)psStack_1e30 >> 0x20) == 0
                                  );
                      auVar57._4_4_ =
                           -(uint)((int)psStack_1d08 == 0 && (int)((ulong)psStack_1d08 >> 0x20) == 0
                                  );
                      auVar57._8_4_ =
                           -(uint)((int)pvVar21 == 0 && (int)((ulong)pvVar21 >> 0x20) == 0);
                      auVar57._12_4_ =
                           -(uint)((int)pvVar16 == 0 && (int)((ulong)pvVar16 >> 0x20) == 0);
                      iVar8 = movmskps(uVar18,auVar57);
                      if ((iVar8 != 0) || (pvVar17 == (void *)0x0)) {
                        secp256k1_scratch_apply_checkpoint
                                  ((secp256k1_callback *)psStack_1d68,
                                   (secp256k1_scratch *)psStack_1d50,uStack_1e28);
                        uVar29 = uStack_1d48;
                        na = (code *)psVar34;
                        break;
                      }
                      if (puVar51 != (undefined1 *)0x0) {
                        psVar44 = &(&asStack_1530[0].ecmult_gen_ctx.ge_offset)[lVar47].x;
                        puVar52 = (undefined1 *)0x0;
                        psVar25 = psStack_1e30;
                        do {
                          *(undefined4 *)((long)(((secp256k1_gej *)na)->x).n + (long)puVar52 * 4) =
                               *(undefined4 *)(auStack_1590 + (long)puVar52 * 4 + lVar47 * 4 + 0x60)
                          ;
                          psVar45 = psVar44;
                          psVar14 = (secp256k1_ge *)auStack_1cd0;
                          for (lVar27 = 0xd; lVar27 != 0; lVar27 = lVar27 + -1) {
                            (psVar14->x).n[0] = psVar45->n[0];
                            psVar45 = (secp256k1_fe *)((long)psVar45 + ((ulong)bVar56 * -2 + 1) * 8)
                            ;
                            psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar56 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar25,(secp256k1_ge *)auStack_1cd0);
                          puVar52 = puVar52 + 1;
                          psVar25 = psVar25 + 1;
                          psVar44 = (secp256k1_fe *)((long)(psVar44 + 2) + 8);
                        } while (puVar31 != puVar52);
                      }
                      psVar25 = psStack_1e30;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)auStack_1e20,
                                 (secp256k1_gej *)auStack_1b30,(size_t)puVar31,psStack_1e30,
                                 (secp256k1_scalar *)na,psStack_1e40);
                      psVar50 = psStack_1d50;
                      secp256k1_scratch_apply_checkpoint
                                ((secp256k1_callback *)psStack_1d68,
                                 (secp256k1_scratch *)psStack_1d50,uStack_1e28);
                    }
                    bVar55 = (_func_void_char_ptr_void_ptr *)0xfffffffffffff8f3 < p_Stack_1d00;
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)auStack_1830,(secp256k1_gej *)auStack_1830,
                               (secp256k1_gej *)auStack_1b30,&psVar25->x);
                    puVar51 = puVar51 + -(long)puVar31;
                    bVar7 = bVar5 ^ 1;
                    lVar47 = 1;
                    psStack_1e40 = (secp256k1_scalar *)0x0;
                    bVar5 = 1;
                    uVar29 = uStack_1d48;
                  } while ((bool)(bVar55 & bVar7));
                }
                psVar38 = (secp256k1_context *)auStack_1830;
                uVar24 = (int)uVar29 * (int)p_Stack_1d70 + (int)psStack_1d18;
                iVar8 = secp256k1_gej_eq_ge_var
                                  ((secp256k1_gej *)psVar38,
                                   (secp256k1_ge *)
                                   (auStack_10b0 +
                                   (ulong)(uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc)) * 0x68));
                if (iVar8 == 0) goto LAB_00114b18;
                uVar29 = uVar29 + 1;
                uVar40 = uStack_1d20;
                psVar38 = psVar50;
              } while (uVar29 != 0xd);
            }
            uVar40 = uVar40 + 1;
            psVar50 = psVar38;
          } while (uVar40 != 0xd);
          psStack_1d78 = (secp256k1_scalar *)((long)psStack_1d78 + 1);
        } while (psStack_1d78 != (secp256k1_scalar *)0xd);
        p_Stack_1d70 = p_Stack_1d70 + 1;
      } while (p_Stack_1d70 != (_func_void_char_ptr_void_ptr *)0xd);
      p_Stack_1d80 = p_Stack_1d80 + 1;
    } while (p_Stack_1d80 != (_func_void_char_ptr_void_ptr *)0xd);
    if (psVar38 != (secp256k1_context *)0x0) {
      lVar47 = 0;
      do {
        if (*(char *)((long)(psVar38->ecmult_gen_ctx).ge_offset.x.n + lVar47 + -8) !=
            "scratch"[lVar47]) {
          (*(psVar15->error_callback).fn)("invalid scratch space",(psVar15->error_callback).data);
          goto LAB_0011348c;
        }
        lVar47 = lVar47 + 1;
      } while (lVar47 != 8);
      if ((psVar38->ecmult_gen_ctx).ge_offset.x.n[1] != 0) goto LAB_00114b72;
      free(psVar38);
    }
LAB_0011348c:
    psVar48 = (secp256k1_scalar *)0x1;
    uVar12 = 0;
    do {
      r = (secp256k1_scalar *)0x1;
      do {
        if (((ulong)num_cores == 1) ||
           (uVar12 = uVar12 + 0xe7037ed1a0b428db,
           (uint32_t)((uVar12 >> 0x20 ^ uVar12 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
           this_core)) {
          auStack_1cd0._0_4_ = 1;
          iVar8 = 1;
          do {
            secp256k1_scalar_verify(psVar48);
            secp256k1_scalar_verify(r);
            secp256k1_scalar_verify(r);
            auStack_1b30._16_8_ = 0;
            auStack_1b30[0x18] = '\0';
            auStack_1b30[0x19] = '\0';
            auStack_1b30[0x1a] = '\0';
            auStack_1b30[0x1b] = '\0';
            auStack_1b30[0x1c] = '\0';
            auStack_1b30[0x1d] = '\0';
            auStack_1b30[0x1e] = '\0';
            auStack_1b30._0_8_ = 0;
            auStack_1b30[8] = '\0';
            auStack_1b30[9] = '\0';
            auStack_1b30[10] = '\0';
            auStack_1b30[0xb] = '\0';
            auStack_1b30[0xc] = '\0';
            auStack_1b30[0xd] = '\0';
            auStack_1b30[0xe] = '\0';
            auStack_1b30[0xf] = '\0';
            auStack_1b30[0x1f] = (uchar)r;
            secp256k1_scalar_verify(psVar48);
            auStack_1830 = (undefined1  [16])0x0;
            auStack_1820._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1820[0xf] = (char)psVar48;
            na = secp256k1_nonce_function_smallint;
            psVar38 = psVar15;
            iVar9 = secp256k1_ecdsa_sign
                              (psVar15,(secp256k1_ecdsa_signature *)(auStack_1590 + 0x60),
                               auStack_1830,auStack_1b30,secp256k1_nonce_function_smallint,
                               auStack_1cd0);
            if (iVar9 != 1) goto LAB_00114b5e;
            lVar47 = 0;
            uVar24 = 0;
            do {
              uVar19 = (uint)(byte)auStack_1590[lVar47 + 0x60] | uVar24 << 8;
              uVar24 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
              if (uVar19 < 0xd) {
                uVar24 = uVar19;
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            uVar19 = 0;
            lVar47 = 0x20;
            do {
              uVar20 = (uint)(byte)auStack_1590[lVar47 + 0x60] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            psVar38 = (secp256k1_context *)auStack_1e20;
            r_from_k((secp256k1_scalar *)psVar38,(secp256k1_ge *)auStack_10b0,auStack_1cd0._0_4_,
                     (int *)0x0);
            if (uVar24 != auStack_1e20._0_4_) goto LAB_00114b63;
            uVar18 = auStack_1cd0._0_4_;
            uVar20 = auStack_1cd0._0_4_ * uVar19;
            uVar24 = uVar24 * (int)r + (int)psVar48;
            iVar9 = uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc);
            if ((uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) != iVar9) &&
               (uVar24 = (0xd - uVar19) * auStack_1cd0._0_4_,
               uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) != iVar9)) goto LAB_00114b68;
            if ((int)auStack_1cd0._0_4_ < iVar8) break;
            iVar8 = auStack_1cd0._0_4_ + 1;
            auStack_1cd0._0_4_ = iVar8;
          } while ((int)uVar18 < 0xc);
        }
        uVar24 = (int)r + 1;
        r = (secp256k1_scalar *)(ulong)uVar24;
      } while (uVar24 != 0xd);
      uVar24 = (int)psVar48 + 1;
      psVar48 = (secp256k1_scalar *)(ulong)uVar24;
    } while (uVar24 != 0xd);
    uVar24 = 1;
    psStack_1e30 = (secp256k1_gej *)0x0;
    uVar10 = num_cores;
    do {
      psStack_1e68 = (secp256k1_gej *)0x1;
      do {
        uVar19 = 1;
        do {
          psStack_1e60 = (secp256k1_gej *)0x1;
          do {
            if ((uVar10 == 1) ||
               (psStack_1e30 = (secp256k1_gej *)((long)psStack_1e30[-0x2a150f76858d35].y.n + 0x23),
               (uint32_t)
               ((ulong)uVar10 * ((ulong)psStack_1e30 >> 0x20 ^ (ulong)psStack_1e30 & 0xffffffff) >>
               0x20) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1e20._0_4_ = uVar19;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e60 & 0xffffffff));
              uVar42 = (int)psStack_1e68 * (int)psStack_1e60;
              uVar42 = uVar42 - (uVar42 / 0xd + (uVar42 / 0xd) * 0xc);
              uVar12 = 0;
              uVar20 = 0;
              uVar30 = 0;
              do {
                r_from_k((secp256k1_scalar *)(auStack_1590 + 0x60),(secp256k1_ge *)auStack_10b0,
                         uVar30,(int *)0x0);
                if (psStack_1e68 ==
                    (secp256k1_gej *)(asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  uVar49 = (int)uVar12 - ((int)(uVar12 / 0xd) + (int)(uVar12 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar49);
                  secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1e60);
                  auStack_1db0._0_4_ = uVar42;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar42);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1db0,(secp256k1_scalar *)auStack_1db0,
                             (secp256k1_scalar *)auStack_1e20);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar49);
                  uVar18 = auStack_1db0._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(auStack_1db0._0_8_ & 0xffffffff));
                  uVar20 = uVar20 | uVar49 == uVar18;
                }
                uVar30 = uVar30 + 1;
                uVar12 = (ulong)((int)uVar12 + uVar24);
              } while (uVar30 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1b30._16_8_ = 0;
              auStack_1b30[0x18] = '\0';
              auStack_1b30[0x19] = '\0';
              auStack_1b30[0x1a] = '\0';
              auStack_1b30[0x1b] = '\0';
              auStack_1b30[0x1c] = '\0';
              auStack_1b30[0x1d] = '\0';
              auStack_1b30[0x1e] = '\0';
              auStack_1b30._0_8_ = 0;
              auStack_1b30[8] = '\0';
              auStack_1b30[9] = '\0';
              auStack_1b30[10] = '\0';
              auStack_1b30[0xb] = '\0';
              auStack_1b30[0xc] = '\0';
              auStack_1b30[0xd] = '\0';
              auStack_1b30[0xe] = '\0';
              auStack_1b30[0xf] = '\0';
              auStack_1b30[0x1f] = (uchar)psStack_1e68;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              auStack_1b30._48_8_ = 0;
              auStack_1af8[0] = '\0';
              auStack_1af8[1] = '\0';
              auStack_1af8[2] = '\0';
              auStack_1af8[3] = '\0';
              auStack_1af8[4] = '\0';
              auStack_1af8[5] = '\0';
              auStack_1af8[6] = '\0';
              auStack_1b30._32_8_ = 0;
              auStack_1b30._40_7_ = 0;
              auStack_1b30[0x2f] = '\0';
              auStack_1af8[7] = (uchar)uVar24;
              puVar36 = (uint64_t *)(auStack_10b0 + (long)psStack_1e60 * 0x68);
              psVar14 = (secp256k1_ge *)(auStack_1590 + 0x60);
              for (lVar47 = 0xd; lVar47 != 0; lVar47 = lVar47 + -1) {
                (psVar14->x).n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar56 * -2 + 1;
                psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar56 * -0x10 + 8);
              }
              secp256k1_pubkey_save
                        ((secp256k1_pubkey *)auStack_1830,(secp256k1_ge *)(auStack_1590 + 0x60));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              auStack_1cd0 = (undefined1  [16])0x0;
              auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1cc0[0xf] = (char)uVar19;
              psVar38 = psVar15;
              uVar30 = secp256k1_ecdsa_verify
                                 (psVar15,(secp256k1_ecdsa_signature *)auStack_1b30,auStack_1cd0,
                                  (secp256k1_pubkey *)auStack_1830);
              uVar10 = num_cores;
              if ((uVar24 < 7 & uVar20) != uVar30) goto LAB_00114b6d;
            }
            psStack_1e60 = (secp256k1_gej *)((long)psStack_1e60 + 1);
          } while (psStack_1e60 != (secp256k1_gej *)0xd);
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xd);
        psStack_1e68 = (secp256k1_gej *)((long)psStack_1e68 + 1);
      } while (psStack_1e68 != (secp256k1_gej *)0xd);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0xd);
    uVar24 = 1;
    psStack_1e50 = (secp256k1_scalar *)0x0;
    do {
      psVar48 = (secp256k1_scalar *)0x1;
      do {
        iVar8 = (int)psVar48;
        if (((ulong)num_cores == 1) ||
           (psStack_1e50 = (secp256k1_scalar *)((long)psStack_1e50 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1e50 >> 0x20 ^ (ulong)psStack_1e50 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          auStack_1db0._0_4_ = 1;
          iVar9 = 1;
          do {
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            secp256k1_scalar_verify(psVar48);
            secp256k1_scalar_verify(psVar48);
            auStack_1cd0 = (undefined1  [16])0x0;
            auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1cc0[0xf] = (char)psVar48;
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
            auStack_1e20 = (undefined1  [16])0x0;
            auStack_1e10._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1e10[0xf] = (char)uVar24;
            na = secp256k1_nonce_function_smallint;
            secp256k1_ecdsa_sign_recoverable
                      (psVar15,(secp256k1_ecdsa_recoverable_signature *)(auStack_1590 + 0x60),
                       auStack_1e20,auStack_1cd0,secp256k1_nonce_function_smallint,auStack_1db0);
            lVar47 = 0;
            uVar19 = 0;
            do {
              uVar20 = (uint)(byte)auStack_1590[lVar47 + 0x60] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            uVar20 = 0;
            lVar47 = 0x20;
            do {
              uVar30 = (uint)(byte)auStack_1590[lVar47 + 0x60] | uVar20 << 8;
              uVar20 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
              if (uVar30 < 0xd) {
                uVar20 = uVar30;
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar20);
            bVar5 = (byte)asStack_1530[0].ecmult_gen_ctx.ge_offset.y.n[1];
            psVar38 = (secp256k1_context *)auStack_1de0;
            r_from_k((secp256k1_scalar *)psVar38,(secp256k1_ge *)auStack_10b0,auStack_1db0._0_4_,
                     (int *)&sStack_1d40);
            if (uVar19 != auStack_1de0._0_4_) goto LAB_00114b77;
            lVar47 = (long)(int)auStack_1db0._0_4_;
            uVar30 = auStack_1db0._0_4_ * uVar20;
            uVar19 = uVar19 * iVar8 + uVar24;
            iVar43 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
            if ((uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar43) &&
               (uVar19 = (0xd - uVar20) * auStack_1db0._0_4_,
               uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar43)) goto LAB_00114b7c;
            uVar19 = (uint)((uint)sStack_1d40.fn != 0) * 2;
            lVar27 = lVar47 * 0x68;
            auStack_1810 = *(uchar (*) [4])(auStack_1060 + lVar27);
            auStack_180c = *(uchar (*) [4])(auStack_105c + lVar27);
            iStack_1808 = aiStack_1058[lVar47 * 0x1a];
            iStack_1804 = aiStack_1058[lVar47 * 0x1a + 1];
            auStack_1830._8_8_ = auStack_1078[lVar47 * 0xd];
            auStack_1830._0_8_ = (&uStack_1080)[lVar47 * 0xd];
            auStack_1820._8_8_ = *(undefined8 *)(auStack_1060 + lVar27 + -8);
            auStack_1820._0_8_ = auStack_1078[lVar47 * 0xd + 1];
            psVar38 = (secp256k1_context *)auStack_1830;
            secp256k1_fe_normalize((secp256k1_fe *)psVar38);
            uVar20 = uVar20 * auStack_1db0._0_4_;
            secp256k1_fe_verify((secp256k1_fe *)psVar38);
            if (uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc) == iVar43) {
              if (iStack_1804 == 0) goto LAB_00114b81;
              uVar19 = auStack_1830._0_4_ & 1 | uVar19;
            }
            else {
              if (iStack_1804 == 0) goto LAB_00114b86;
              uVar19 = (auStack_1830._0_4_ & 1 | uVar19) ^ 1;
            }
            if (uVar19 != bVar5) goto LAB_00114b8b;
            secp256k1_ecdsa_recoverable_signature_convert
                      (psVar15,(secp256k1_ecdsa_signature *)auStack_1b30,
                       (secp256k1_ecdsa_recoverable_signature *)(auStack_1590 + 0x60));
            lVar47 = 0;
            uVar19 = 0;
            do {
              uVar20 = (uint)(byte)auStack_1b30[lVar47] | uVar19 << 8;
              uVar19 = uVar20 - (uVar20 / 0xd + (uVar20 / 0xd) * 0xc);
              if (uVar20 < 0xd) {
                uVar19 = uVar20;
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x20);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
            uVar20 = 0;
            lVar47 = 0x20;
            do {
              uVar30 = (uint)(byte)auStack_1b30[lVar47] | uVar20 << 8;
              uVar20 = uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc);
              if (uVar30 < 0xd) {
                uVar20 = uVar30;
              }
              lVar47 = lVar47 + 1;
            } while (lVar47 != 0x40);
            secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar20);
            psVar38 = (secp256k1_context *)auStack_1de0;
            r_from_k((secp256k1_scalar *)psVar38,(secp256k1_ge *)auStack_10b0,auStack_1db0._0_4_,
                     (int *)0x0);
            if (uVar19 != auStack_1de0._0_4_) goto LAB_00114b90;
            uVar18 = auStack_1db0._0_4_;
            uVar30 = auStack_1db0._0_4_ * uVar20;
            uVar19 = uVar19 * iVar8 + uVar24;
            iVar43 = uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc);
            if ((uVar30 - (uVar30 / 0xd + (uVar30 / 0xd) * 0xc) != iVar43) &&
               (uVar19 = (0xd - uVar20) * auStack_1db0._0_4_,
               uVar19 - (uVar19 / 0xd + (uVar19 / 0xd) * 0xc) != iVar43)) goto LAB_00114b95;
            if ((int)auStack_1db0._0_4_ < iVar9) break;
            iVar9 = auStack_1db0._0_4_ + 1;
            auStack_1db0._0_4_ = iVar9;
          } while ((int)uVar18 < 0xc);
        }
        psVar48 = (secp256k1_scalar *)(ulong)(iVar8 + 1U);
      } while (iVar8 + 1U != 0xd);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0xd);
    uVar24 = 1;
    psStack_1e40 = (secp256k1_scalar *)0x0;
    uVar10 = num_cores;
    do {
      psStack_1e68 = (secp256k1_gej *)0x1;
      do {
        uVar19 = 1;
        do {
          psStack_1e50 = (secp256k1_scalar *)0x1;
          do {
            if ((uVar10 == 1) ||
               (psStack_1e40 = (secp256k1_scalar *)((long)psStack_1e40 + 0xe7037ed1a0b428db),
               (uint32_t)
               ((ulong)uVar10 * ((ulong)psStack_1e40 >> 0x20 ^ (ulong)psStack_1e40 & 0xffffffff) >>
               0x20) == this_core)) {
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1db0._0_4_ = uVar19;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e50 & 0xffffffff));
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar19);
              auStack_1e20 = (undefined1  [16])0x0;
              auStack_1e10._0_15_ = SUB1615((undefined1  [16])0x0,0);
              auStack_1e10[0xf] = (char)uVar19;
              uVar42 = (int)psStack_1e68 * (int)psStack_1e50;
              uVar42 = uVar42 - (uVar42 / 0xd + (uVar42 / 0xd) * 0xc);
              uVar12 = 0;
              uVar20 = 0;
              uVar30 = 0;
              do {
                r_from_k((secp256k1_scalar *)(auStack_1590 + 0x60),(secp256k1_ge *)auStack_10b0,
                         uVar30,(int *)0x0);
                if (psStack_1e68 ==
                    (secp256k1_gej *)(asStack_1530[0].ecmult_gen_ctx._0_8_ & 0xffffffff)) {
                  uVar49 = (int)uVar12 - ((int)(uVar12 / 0xd) + (int)(uVar12 / 0xd) * 0xc);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar30);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar49);
                  secp256k1_scalar_verify((secp256k1_scalar *)psStack_1e68);
                  secp256k1_scalar_verify(psStack_1e50);
                  auStack_1de0._0_4_ = uVar42;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar42);
                  secp256k1_scalar_add
                            ((secp256k1_scalar *)auStack_1de0,(secp256k1_scalar *)auStack_1de0,
                             (secp256k1_scalar *)auStack_1db0);
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar49);
                  uVar18 = auStack_1de0._0_4_;
                  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)(uint)auStack_1de0._0_4_);
                  uVar20 = uVar20 | uVar49 == uVar18;
                }
                uVar30 = uVar30 + 1;
                uVar12 = (ulong)((int)uVar12 + uVar24);
              } while (uVar30 != 0xd);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              secp256k1_scalar_verify((secp256k1_scalar *)((ulong)psStack_1e68 & 0xffffffff));
              auStack_1b30._16_8_ = 0;
              auStack_1b30[0x18] = '\0';
              auStack_1b30[0x19] = '\0';
              auStack_1b30[0x1a] = '\0';
              auStack_1b30[0x1b] = '\0';
              auStack_1b30[0x1c] = '\0';
              auStack_1b30[0x1d] = '\0';
              auStack_1b30[0x1e] = '\0';
              auStack_1b30._0_8_ = 0;
              auStack_1b30[8] = '\0';
              auStack_1b30[9] = '\0';
              auStack_1b30[10] = '\0';
              auStack_1b30[0xb] = '\0';
              auStack_1b30[0xc] = '\0';
              auStack_1b30[0xd] = '\0';
              auStack_1b30[0xe] = '\0';
              auStack_1b30[0xf] = '\0';
              auStack_1b30[0x1f] = (uchar)psStack_1e68;
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              auStack_1b30._48_8_ = 0;
              auStack_1af8[0] = '\0';
              auStack_1af8[1] = '\0';
              auStack_1af8[2] = '\0';
              auStack_1af8[3] = '\0';
              auStack_1af8[4] = '\0';
              auStack_1af8[5] = '\0';
              auStack_1af8[6] = '\0';
              auStack_1b30._32_8_ = 0;
              auStack_1b30._40_7_ = 0;
              auStack_1b30[0x2f] = '\0';
              auStack_1af8[7] = (uchar)uVar24;
              auVar4[0xf] = 0;
              auVar4._0_15_ = auStack_1af0._1_15_;
              auStack_1af0 = auVar4 << 8;
              secp256k1_ecdsa_recoverable_signature_convert
                        (psVar15,(secp256k1_ecdsa_signature *)auStack_1830,
                         (secp256k1_ecdsa_recoverable_signature *)auStack_1b30);
              puVar36 = (uint64_t *)(auStack_10b0 + (long)psStack_1e50 * 0x68);
              psVar14 = (secp256k1_ge *)(auStack_1590 + 0x60);
              for (lVar47 = 0xd; lVar47 != 0; lVar47 = lVar47 + -1) {
                (psVar14->x).n[0] = *puVar36;
                puVar36 = puVar36 + (ulong)bVar56 * -2 + 1;
                psVar14 = (secp256k1_ge *)((long)psVar14 + (ulong)bVar56 * -0x10 + 8);
              }
              secp256k1_pubkey_save
                        ((secp256k1_pubkey *)auStack_1cd0,(secp256k1_ge *)(auStack_1590 + 0x60));
              psVar38 = psVar15;
              uVar30 = secp256k1_ecdsa_verify
                                 (psVar15,(secp256k1_ecdsa_signature *)auStack_1830,auStack_1e20,
                                  (secp256k1_pubkey *)auStack_1cd0);
              uVar10 = num_cores;
              if ((uVar24 < 7 & uVar20) != uVar30) goto LAB_00114b9a;
            }
            psStack_1e50 = (secp256k1_scalar *)((long)psStack_1e50 + 1);
          } while (psStack_1e50 != (secp256k1_scalar *)0xd);
          uVar19 = uVar19 + 1;
        } while (uVar19 != 0xd);
        psStack_1e68 = (secp256k1_gej *)((long)psStack_1e68 + 1);
      } while (psStack_1e68 != (secp256k1_gej *)0xd);
      uVar24 = uVar24 + 1;
    } while (uVar24 != 0xd);
    uVar12 = 1;
    puVar51 = auStack_1b70;
    puVar31 = auStack_1cd0;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar12 & 0xffffffff));
      secp256k1_scalar_verify((secp256k1_scalar *)(uVar12 & 0xffffffff));
      auStack_1de0 = (undefined1  [16])0x0;
      auStack_1dd0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1dd0[0xf] = (char)uVar12;
      lVar47 = uVar12 - 1;
      psVar38 = psVar15;
      iVar8 = secp256k1_keypair_create
                        (psVar15,(secp256k1_keypair *)(auStack_1590 + uVar12 * 0x60),auStack_1de0);
      if (iVar8 == 0) goto LAB_00114b9f;
      psVar38 = psVar15;
      iVar8 = secp256k1_ec_pubkey_create
                        (psVar15,(secp256k1_pubkey *)(auStack_1b30 + lVar47 * 0x40),auStack_1de0);
      if (iVar8 == 0) goto LAB_00114ba4;
      psVar54 = (secp256k1_xonly_pubkey *)(auStack_1830 + lVar47 * 0x40);
      pk_parity = (uint *)(auStack_1e20 + lVar47 * 4);
      psVar38 = psVar15;
      iVar8 = secp256k1_keypair_xonly_pub
                        (psVar15,psVar54,(int *)pk_parity,
                         (secp256k1_keypair *)(auStack_1590 + uVar12 * 0x60));
      if (iVar8 == 0) goto LAB_00114ba9;
      puVar53 = auStack_1cd0 + lVar47 * 0x20;
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar15,puVar53,psVar54);
      if (iVar8 == 0) goto LAB_00114bae;
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_parse(psVar15,psVar54,puVar53);
      if (iVar8 == 0) goto LAB_00114bb3;
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar15,auStack_1de0,psVar54);
      if (iVar8 == 0) goto LAB_00114bb8;
      lVar27 = 0;
      do {
        if (puVar31[lVar27] != auStack_1de0[lVar27]) goto LAB_00114bbd;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x20);
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_from_pubkey
                        (psVar15,psVar54,(int *)&sStack_1d40,
                         (secp256k1_pubkey *)(auStack_1b30 + lVar47 * 0x40));
      if (iVar8 == 0) goto LAB_00114bc2;
      if ((uint)sStack_1d40.fn != *pk_parity) goto LAB_00114bc7;
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar15,auStack_1de0,psVar54);
      if (iVar8 == 0) goto LAB_00114bcc;
      lVar47 = 0;
      do {
        if (puVar31[lVar47] != auStack_1de0[lVar47]) goto LAB_00114bd1;
        lVar47 = lVar47 + 1;
      } while (lVar47 != 0x20);
      psVar38 = (secp256k1_context *)auStack_1db0;
      secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar38,puVar53);
      auStack_1db0._40_8_ = 1;
      secp256k1_fe_verify((secp256k1_fe *)psVar38);
      lVar47 = uVar12 * 0x68;
      iVar8 = secp256k1_fe_equal((secp256k1_fe *)psVar38,
                                 (secp256k1_fe *)(auStack_10b0 + uVar12 * 0x68));
      if (iVar8 == 0) goto LAB_00114bd6;
      auStack_1db0._0_8_ = (&uStack_1080)[uVar12 * 0xd];
      auStack_1db0._8_8_ = auStack_1078[uVar12 * 0xd];
      auStack_1db0._16_8_ = auStack_1078[uVar12 * 0xd + 1];
      auStack_1db0._24_8_ = *(undefined8 *)(auStack_1060 + lVar47 + -8);
      auStack_1db0._32_4_ = *(undefined4 *)(auStack_1060 + lVar47);
      auStack_1db0._36_4_ = *(undefined4 *)(auStack_105c + lVar47);
      auStack_1db0._44_4_ = aiStack_1058[uVar12 * 0x1a + 1];
      auStack_1db0._40_4_ = aiStack_1058[uVar12 * 0x1a];
      psVar38 = (secp256k1_context *)auStack_1db0;
      secp256k1_fe_normalize_var((secp256k1_fe *)psVar38);
      secp256k1_fe_verify((secp256k1_fe *)psVar38);
      if (auStack_1db0._44_4_ == 0) goto LAB_00114bdb;
      if ((auStack_1db0._0_4_ & 1) != *pk_parity) goto LAB_00114be0;
      if (6 < uVar12) {
        lVar47 = 0;
        do {
          if (puVar31[lVar47] != puVar51[lVar47]) goto LAB_00114be5;
          lVar47 = lVar47 + 1;
        } while (lVar47 != 0x20);
        if ((auStack_1db0._0_4_ & 1) != 1U - *(int *)(auStack_1e20 + (0xc - uVar12) * 4))
        goto LAB_00114bea;
      }
      uVar12 = uVar12 + 1;
      puVar31 = puVar31 + 0x20;
      puVar51 = puVar51 + -0x20;
    } while (uVar12 != 0xd);
    lVar47 = 0;
    do {
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_parse
                        (psVar15,(secp256k1_xonly_pubkey *)(auStack_1590 + 0x60),
                         invalid_pubkey_bytes[0] + lVar47);
      if (iVar8 != 0) goto LAB_00114bef;
      lVar47 = lVar47 + 0x20;
    } while (lVar47 != 0xe0);
    uVar24 = 1;
    puVar6 = auStack_1590;
    psVar54 = (secp256k1_xonly_pubkey *)auStack_1b30;
    puVar53 = auStack_1830;
    lVar47 = 0;
    do {
      keypair = (secp256k1_keypair *)(puVar6 + 0x60);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      auStack_1cd0 = (undefined1  [16])0x0;
      auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1cc0[0xf] = (char)uVar24;
      psVar38 = psVar15;
      iVar8 = secp256k1_keypair_create(psVar15,keypair,auStack_1cd0);
      if (iVar8 == 0) goto LAB_00114bf4;
      psVar38 = psVar15;
      iVar8 = secp256k1_keypair_xonly_pub(psVar15,psVar54,(int *)(auStack_1db0 + lVar47),keypair);
      if (iVar8 == 0) goto LAB_00114bf9;
      psVar38 = psVar15;
      iVar8 = secp256k1_xonly_pubkey_serialize(psVar15,puVar53,psVar54);
      if (iVar8 == 0) goto LAB_00114bfe;
      lVar47 = lVar47 + 4;
      puVar53 = puVar53 + 0x20;
      psVar54 = psVar54 + 1;
      puVar6 = keypair->data;
      uVar24 = uVar24 + 1;
    } while (lVar47 != 0x30);
    sStack_1ce8.magic[0] = 0xda;
    sStack_1ce8.magic[1] = 'o';
    sStack_1ce8.magic[2] = 0xb3;
    sStack_1ce8.magic[3] = 0x8c;
    sStack_1ce8._4_4_ = 0;
    psStack_1e60 = (secp256k1_gej *)0x1;
    psStack_1e50 = (secp256k1_scalar *)0x0;
    do {
      iVar8 = 0xd - (int)psStack_1e60;
      if ((&iStack_1db4)[(long)psStack_1e60] == 0) {
        iVar8 = (int)psStack_1e60;
      }
      iStack_1e34 = 1;
      do {
        auStack_1e00 = (undefined1  [16])0x0;
        auStack_1e10 = (undefined1  [16])0x0;
        auStack_1e20 = (undefined1  [16])0x0;
        iStack_1df0 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1e50 = (secp256k1_scalar *)((long)psStack_1e50 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1e50 >> 0x20 ^ (ulong)psStack_1e50 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          sStack_1ce8.noncefp = secp256k1_hardened_nonce_function_smallint;
          sStack_1ce8.ndata = &iStack_1e34;
          iVar9 = 0xd - iStack_1e34;
          if ((&iStack_1db4)[iStack_1e34] == 0) {
            iVar9 = iStack_1e34;
          }
          iVar43 = 0;
          do {
            testrand256(auStack_1de0);
            na = (code *)(auStack_1830 + ((long)psStack_1e60 + -1) * 0x20);
            secp256k1_schnorrsig_challenge
                      (&uStack_1d5c,auStack_1850 + (long)iStack_1e34 * 0x20,auStack_1de0,0x20,
                       (uchar *)(auStack_1830 + ((long)psStack_1e60 + -1) * 0x20));
            uVar12 = (ulong)uStack_1d5c;
            if (*(int *)(auStack_1e20 + uVar12 * 4) == 0) {
              uVar24 = uStack_1d5c * iVar8 + iVar9;
              uVar24 = uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc);
              secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
              sStack_1d40.fn = (_func_void_char_ptr_void_ptr *)0x0;
              sStack_1d40.data = (void *)0x0;
              sStack_1d30._0_15_ = SUB1615((undefined1  [16])0x0,0);
              sStack_1d30.data._7_1_ = (char)uVar24;
              psVar38 = psVar15;
              na = (code *)(auStack_1590 + (long)psStack_1e60 * 0x60);
              iVar11 = secp256k1_schnorrsig_sign_custom
                                 (psVar15,auStack_1cd0,auStack_1de0,0x20,
                                  (secp256k1_keypair *)(auStack_1590 + (long)psStack_1e60 * 0x60),
                                  &sStack_1ce8);
              if (iVar11 == 0) goto LAB_00114c03;
              lVar47 = 0;
              do {
                if (auStack_1cd0[lVar47] != auStack_1850[lVar47 + (long)iStack_1e34 * 0x20])
                goto LAB_00114c08;
                lVar47 = lVar47 + 1;
              } while (lVar47 != 0x20);
              lVar47 = 0;
              do {
                if (auStack_1cb0[lVar47] != *(char *)((long)&sStack_1d40.fn + lVar47))
                goto LAB_00114c0d;
                lVar47 = lVar47 + 1;
              } while (lVar47 != 0x20);
              *(undefined4 *)(auStack_1e20 + uVar12 * 4) = 1;
              iVar43 = iVar43 + 1;
            }
          } while (iVar43 < 0xd);
        }
        iVar9 = iStack_1e34 + 1;
        bVar55 = iStack_1e34 < 0xc;
        iStack_1e34 = iVar9;
      } while (bVar55);
      psStack_1e60 = (secp256k1_gej *)((long)psStack_1e60 + 1);
    } while (psStack_1e60 != (secp256k1_gej *)0xd);
    psStack_1e60 = (secp256k1_gej *)0x1;
    psStack_1e50 = (secp256k1_scalar *)0x0;
    do {
      lVar47 = ((long)psStack_1e60 + -1) * 0x20;
      auStack_1dd0 = *(undefined1 (*) [16])(auStack_1820 + lVar47);
      iVar8 = 0xd - (int)psStack_1e60;
      if ((&iStack_1db4)[(long)psStack_1e60] == 0) {
        iVar8 = (int)psStack_1e60;
      }
      psStack_1e30 = (secp256k1_gej *)CONCAT44(psStack_1e30._4_4_,iVar8);
      auStack_1de0._8_8_ = *(undefined8 *)(auStack_1830 + lVar47 + 8);
      auStack_1de0._0_8_ = *(undefined8 *)(auStack_1830 + lVar47);
      psStack_1e68 = (secp256k1_gej *)(auStack_1b30 + ((long)psStack_1e60 + -1) * 0x40);
      uVar12 = 1;
      do {
        auStack_1e00 = (undefined1  [16])0x0;
        auStack_1e10 = (undefined1  [16])0x0;
        auStack_1e20 = (undefined1  [16])0x0;
        iStack_1df0 = 0;
        if (((ulong)num_cores == 1) ||
           (psStack_1e50 = (secp256k1_scalar *)((long)psStack_1e50 + 0xe7037ed1a0b428db),
           (uint32_t)
           (((ulong)psStack_1e50 >> 0x20 ^ (ulong)psStack_1e50 & 0xffffffff) * (ulong)num_cores >>
           0x20) == this_core)) {
          if (uVar12 < 7) {
            lVar47 = (uVar12 - 1) * 0x20;
            auStack_1cc0 = *(undefined1 (*) [16])(auStack_1820 + lVar47);
            auStack_1cd0._8_8_ = *(undefined8 *)(auStack_1830 + lVar47 + 8);
            auStack_1cd0._0_8_ = *(undefined8 *)(auStack_1830 + lVar47);
            iVar8 = 0xd - (int)uVar12;
            if ((&iStack_1db4)[uVar12] == 0) {
              iVar8 = (int)uVar12;
            }
          }
          else {
            auStack_1cd0 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar12 * 4 + 2);
            auStack_1cc0 = *(undefined1 (*) [16])(secp256k1_ellswift_c4.n + uVar12 * 4 + 4);
            iVar8 = -1;
          }
          uStack_1e28 = CONCAT44(uStack_1e28._4_4_,(uint)(iVar8 != -1));
          iVar9 = 0;
          do {
            testrand256((uchar *)&sStack_1d40);
            na = (code *)auStack_1de0;
            secp256k1_schnorrsig_challenge
                      ((secp256k1_scalar *)&sStack_1ce8,auStack_1cd0,(uchar *)&sStack_1d40,0x20,
                       (uchar *)na);
            uVar22 = sStack_1ce8._0_8_ & 0xffffffff;
            if (*(int *)(auStack_1e20 + uVar22 * 4) == 0) {
              uVar24 = sStack_1ce8.magic * (int)psStack_1e30 + iVar8;
              iVar11 = 0;
              iVar43 = 0;
              do {
                if (iVar11 == 0xe) {
                  testrand256(auStack_1cb0);
                  uVar19 = 0;
                }
                else {
                  auStack_1cb0 = (undefined1  [16])0x0;
                  auStack_1ca0._0_15_ = SUB1615((undefined1  [16])0x0,0);
                  auStack_1ca0[0xf] = (char)iVar11;
                  uVar19 = 0;
                  if (iVar11 != 0xd && iVar8 != -1) {
                    uVar19 = (uint)(uVar24 - (uVar24 / 0xd + (uVar24 / 0xd) * 0xc) == iVar11);
                  }
                }
                psVar38 = psVar15;
                na = (code *)psStack_1e68;
                uVar20 = secp256k1_schnorrsig_verify
                                   (psVar15,auStack_1cd0,(uchar *)&sStack_1d40,0x20,
                                    (secp256k1_xonly_pubkey *)psStack_1e68);
                if (uVar20 != uVar19) goto LAB_00114c12;
                iVar43 = iVar43 + uVar19;
                iVar11 = iVar11 + 1;
              } while (iVar11 != 0xf);
              if (iVar43 != (int)uStack_1e28) goto LAB_00114c17;
              *(undefined4 *)(auStack_1e20 + uVar22 * 4) = 1;
              iVar9 = iVar9 + 1;
            }
          } while (iVar9 < 0xd);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0xe);
      psStack_1e60 = (secp256k1_gej *)((long)psStack_1e60 + 1);
    } while (psStack_1e60 != (secp256k1_gej *)0x7);
    lVar47 = 0x68;
    uVar24 = 1;
    do {
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar24);
      auStack_1cd0 = (undefined1  [16])0x0;
      auStack_1cc0._0_15_ = SUB1615((undefined1  [16])0x0,0);
      auStack_1cc0[0xf] = (char)uVar24;
      psVar38 = psVar15;
      iVar8 = secp256k1_ellswift_create(psVar15,auStack_1b30,auStack_1cd0,(uchar *)0x0);
      if (iVar8 == 0) goto LAB_00114c1c;
      secp256k1_ellswift_decode(psVar15,(secp256k1_pubkey *)auStack_1830,auStack_1b30);
      psVar38 = (secp256k1_context *)(auStack_1590 + 0x60);
      secp256k1_pubkey_load(psVar15,(secp256k1_ge *)psVar38,(secp256k1_pubkey *)auStack_1830);
      iVar8 = secp256k1_ge_eq_var((secp256k1_ge *)psVar38,(secp256k1_ge *)(auStack_10b0 + lVar47));
      if (iVar8 == 0) goto LAB_00114c21;
      lVar47 = lVar47 + 0x68;
      uVar24 = uVar24 + 1;
    } while (lVar47 != 0x548);
    secp256k1_context_destroy(psVar15);
    iVar8 = count;
  }
LAB_00114b40:
  main_cold_70();
LAB_00114b45:
  main_cold_66();
LAB_00114b4a:
  main_cold_65();
LAB_00114b4f:
  main_cold_74();
LAB_00114b54:
  main_cold_73();
LAB_00114b59:
  main_cold_72();
LAB_00114b5e:
  main_cold_11();
LAB_00114b63:
  main_cold_12();
LAB_00114b68:
  main_cold_13();
LAB_00114b6d:
  main_cold_14();
LAB_00114b72:
  main_cold_10();
LAB_00114b77:
  main_cold_15();
LAB_00114b7c:
  main_cold_16();
LAB_00114b81:
  main_cold_49();
LAB_00114b86:
  main_cold_17();
LAB_00114b8b:
  main_cold_18();
LAB_00114b90:
  main_cold_19();
LAB_00114b95:
  main_cold_20();
LAB_00114b9a:
  main_cold_21();
LAB_00114b9f:
  main_cold_48();
LAB_00114ba4:
  main_cold_47();
LAB_00114ba9:
  main_cold_46();
LAB_00114bae:
  main_cold_45();
LAB_00114bb3:
  main_cold_44();
LAB_00114bb8:
  main_cold_43();
LAB_00114bbd:
  main_cold_22();
LAB_00114bc2:
  main_cold_42();
LAB_00114bc7:
  main_cold_23();
LAB_00114bcc:
  main_cold_41();
LAB_00114bd1:
  main_cold_24();
LAB_00114bd6:
  main_cold_40();
LAB_00114bdb:
  main_cold_39();
LAB_00114be0:
  main_cold_25();
LAB_00114be5:
  main_cold_26();
LAB_00114bea:
  main_cold_27();
LAB_00114bef:
  main_cold_28();
LAB_00114bf4:
  main_cold_38();
LAB_00114bf9:
  main_cold_37();
LAB_00114bfe:
  main_cold_36();
LAB_00114c03:
  main_cold_35();
LAB_00114c08:
  main_cold_29();
LAB_00114c0d:
  main_cold_30();
LAB_00114c12:
  main_cold_31();
LAB_00114c17:
  main_cold_32();
LAB_00114c1c:
  main_cold_34();
LAB_00114c21:
  main_cold_33();
  lVar47 = 0;
  do {
    uVar40 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar32 = secp256k1_test_state[1] << 0x11;
    uVar22 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar12 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar22;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar12;
    secp256k1_test_state[3] = uVar12 << 0x2d | uVar12 >> 0x13;
    secp256k1_test_state[2] = uVar22 ^ uVar32;
    (psVar38->ecmult_gen_ctx).ge_offset.x.n[lVar47 + -1] = uVar40;
    lVar47 = lVar47 + 1;
  } while ((int)lVar47 != 4);
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_frac_var(secp256k1_fe *xn, secp256k1_fe *xd, const secp256k1_fe *u, const secp256k1_fe *t) {
    /* The implemented algorithm is the following (all operations in GF(p)):
     *
     * - Let c0 = sqrt(-3) = 0xa2d2ba93507f1df233770c2a797962cc61f6d15da14ecd47d8d27ae1cd5f852.
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - If u^3+7+t^2 = 0, set t = 2*t.
     * - Let X = (u^3+7-t^2)/(2*t).
     * - Let Y = (X+t)/(c0*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = (X/Y-u)/2 (which is now guaranteed to be a valid x coordinate).
     *
     * Introducing s=t^2, g=u^3+7, and simplifying x1=-(x2+u) we get:
     *
     * - Let c0 = ...
     * - If u = 0, set u = 1.
     * - If t = 0, set t = 1.
     * - Let s = t^2
     * - Let g = u^3+7
     * - If g+s = 0, set t = 2*t, s = 4*s
     * - Let X = (g-s)/(2*t).
     * - Let Y = (X+t)/(c0*u) = (g+s)/(2*c0*t*u).
     * - If x3 = u+4*Y^2 is a valid x coordinate, return it.
     * - If x2 = (-X/Y-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Now substitute Y^2 = -(g+s)^2/(12*s*u^2) and X/Y = c0*u*(g-s)/(g+s). This
     * means X and Y do not need to be evaluated explicitly anymore.
     *
     * - ...
     * - If g+s = 0, set s = 4*s.
     * - If x3 = u-(g+s)^2/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = (-c0*u*(g-s)/(g+s)-u)/2 is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     *
     * Simplifying x2 using 2 additional constants:
     *
     * - Let c1 = (c0-1)/2 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = (-c0-1)/2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - ...
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - ...
     *
     * Writing x3 as a fraction:
     *
     * - ...
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) ...
     * - ...

     * Overall, we get:
     *
     * - Let c1 = 0x851695d49a83f8ef919bb86153cbcb16630fb68aed0a766a3ec693d68e6afa40.
     * - Let c2 = 0x7ae96a2b657c07106e64479eac3434e99cf0497512f58995c1396c28719501ee.
     * - If u = 0, set u = 1.
     * - If t = 0, set s = 1, else set s = t^2.
     * - Let g = u^3+7.
     * - If g+s = 0, set s = 4*s.
     * - If x3 = (3*s*u^3-(g+s)^2)/(3*s*u^2) is a valid x coordinate, return it.
     * - If x2 = u*(c1*s+c2*g)/(g+s) is a valid x coordinate, return it.
     * - Return x1 = -(x2+u).
     */
    secp256k1_fe u1, s, g, p, d, n, l;
    u1 = *u;
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&u1), 0)) u1 = secp256k1_fe_one;
    secp256k1_fe_sqr(&s, t);
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(t), 0)) s = secp256k1_fe_one;
    secp256k1_fe_sqr(&l, &u1);                                   /* l = u^2 */
    secp256k1_fe_mul(&g, &l, &u1);                               /* g = u^3 */
    secp256k1_fe_add_int(&g, SECP256K1_B);                       /* g = u^3 + 7 */
    p = g;                                                       /* p = g */
    secp256k1_fe_add(&p, &s);                                    /* p = g+s */
    if (EXPECT(secp256k1_fe_normalizes_to_zero_var(&p), 0)) {
        secp256k1_fe_mul_int(&s, 4);
        /* Recompute p = g+s */
        p = g;                                                   /* p = g */
        secp256k1_fe_add(&p, &s);                                /* p = g+s */
    }
    secp256k1_fe_mul(&d, &s, &l);                                /* d = s*u^2 */
    secp256k1_fe_mul_int(&d, 3);                                 /* d = 3*s*u^2 */
    secp256k1_fe_sqr(&l, &p);                                    /* l = (g+s)^2 */
    secp256k1_fe_negate(&l, &l, 1);                              /* l = -(g+s)^2 */
    secp256k1_fe_mul(&n, &d, &u1);                               /* n = 3*s*u^3 */
    secp256k1_fe_add(&n, &l);                                    /* n = 3*s*u^3-(g+s)^2 */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &d)) {
        /* Return x3 = n/d = (3*s*u^3-(g+s)^2)/(3*s*u^2) */
        *xn = n;
        *xd = d;
        return;
    }
    *xd = p;
    secp256k1_fe_mul(&l, &secp256k1_ellswift_c1, &s);            /* l = c1*s */
    secp256k1_fe_mul(&n, &secp256k1_ellswift_c2, &g);            /* n = c2*g */
    secp256k1_fe_add(&n, &l);                                    /* n = c1*s+c2*g */
    secp256k1_fe_mul(&n, &n, &u1);                               /* n = u*(c1*s+c2*g) */
    /* Possible optimization: in the invocation below, p^2 = (g+s)^2 is computed,
     * which we already have computed above. This could be deduplicated. */
    if (secp256k1_ge_x_frac_on_curve_var(&n, &p)) {
        /* Return x2 = n/p = u*(c1*s+c2*g)/(g+s) */
        *xn = n;
        return;
    }
    secp256k1_fe_mul(&l, &p, &u1);                               /* l = u*(g+s) */
    secp256k1_fe_add(&n, &l);                                    /* n = u*(c1*s+c2*g)+u*(g+s) */
    secp256k1_fe_negate(xn, &n, 2);                              /* n = -u*(c1*s+c2*g)-u*(g+s) */

    VERIFY_CHECK(secp256k1_ge_x_frac_on_curve_var(xn, &p));
    /* Return x3 = n/p = -(u*(c1*s+c2*g)/(g+s)+u) */
}